

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  ulong uVar55;
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  uint uVar69;
  undefined1 (*pauVar70) [32];
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  int iVar74;
  ulong uVar75;
  bool bVar76;
  bool bVar77;
  byte bVar78;
  float fVar79;
  undefined8 uVar81;
  float fVar113;
  vint4 bi_2;
  undefined1 auVar82 [16];
  float fVar112;
  float fVar114;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined4 uVar80;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar86 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 extraout_var [60];
  undefined1 auVar111 [64];
  float fVar115;
  float fVar139;
  float fVar140;
  vint4 bi_1;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar125 [16];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar154 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar159 [16];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar186;
  float fVar187;
  vint4 ai_2;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar178 [32];
  float fVar188;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar177 [16];
  undefined1 auVar185 [32];
  vint4 ai;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [28];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  vint4 bi;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar238;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  vint4 ai_1;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  float fVar248;
  float fVar253;
  float fVar254;
  undefined1 auVar249 [16];
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar250 [32];
  float fVar255;
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar261 [32];
  undefined1 auVar277 [32];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar262 [64];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_bc8;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  uint uStack_b04;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  RTCFilterFunctionNArguments local_9f0;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined4 local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [16];
  undefined1 auStack_7b0 [16];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  uint local_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  RTCHitN local_6e0 [16];
  undefined1 auStack_6d0 [16];
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined1 local_680 [16];
  uint local_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint uStack_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  uint local_620;
  uint uStack_61c;
  uint uStack_618;
  uint uStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  uint uStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var_00 [60];
  
  PVar1 = prim[1];
  uVar73 = (ulong)(byte)PVar1;
  fVar79 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar82._0_4_ = fVar79 * auVar5._0_4_;
  auVar82._4_4_ = fVar79 * auVar5._4_4_;
  auVar82._8_4_ = fVar79 * auVar5._8_4_;
  auVar82._12_4_ = fVar79 * auVar5._12_4_;
  auVar210._0_4_ = fVar79 * auVar6._0_4_;
  auVar210._4_4_ = fVar79 * auVar6._4_4_;
  auVar210._8_4_ = fVar79 * auVar6._8_4_;
  auVar210._12_4_ = fVar79 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar73 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar75 = (ulong)(uint)((int)(uVar73 * 9) * 2);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 + uVar73 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  uVar75 = (ulong)(uint)((int)(uVar73 * 5) << 2);
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar75 + 6)));
  auVar149 = vcvtdq2ps_avx(auVar149);
  auVar272._4_4_ = auVar210._0_4_;
  auVar272._0_4_ = auVar210._0_4_;
  auVar272._8_4_ = auVar210._0_4_;
  auVar272._12_4_ = auVar210._0_4_;
  auVar117 = vshufps_avx(auVar210,auVar210,0x55);
  auVar83 = vshufps_avx(auVar210,auVar210,0xaa);
  fVar79 = auVar83._0_4_;
  auVar259._0_4_ = fVar79 * auVar7._0_4_;
  fVar112 = auVar83._4_4_;
  auVar259._4_4_ = fVar112 * auVar7._4_4_;
  fVar113 = auVar83._8_4_;
  auVar259._8_4_ = fVar113 * auVar7._8_4_;
  fVar114 = auVar83._12_4_;
  auVar259._12_4_ = fVar114 * auVar7._12_4_;
  auVar249._0_4_ = auVar10._0_4_ * fVar79;
  auVar249._4_4_ = auVar10._4_4_ * fVar112;
  auVar249._8_4_ = auVar10._8_4_ * fVar113;
  auVar249._12_4_ = auVar10._12_4_ * fVar114;
  auVar239._0_4_ = auVar149._0_4_ * fVar79;
  auVar239._4_4_ = auVar149._4_4_ * fVar112;
  auVar239._8_4_ = auVar149._8_4_ * fVar113;
  auVar239._12_4_ = auVar149._12_4_ * fVar114;
  auVar83 = vfmadd231ps_fma(auVar259,auVar117,auVar6);
  auVar118 = vfmadd231ps_fma(auVar249,auVar117,auVar9);
  auVar117 = vfmadd231ps_fma(auVar239,auVar84,auVar117);
  auVar91 = vfmadd231ps_fma(auVar83,auVar272,auVar5);
  auVar118 = vfmadd231ps_fma(auVar118,auVar272,auVar8);
  auVar193 = vfmadd231ps_fma(auVar117,auVar85,auVar272);
  auVar273._4_4_ = auVar82._0_4_;
  auVar273._0_4_ = auVar82._0_4_;
  auVar273._8_4_ = auVar82._0_4_;
  auVar273._12_4_ = auVar82._0_4_;
  auVar117 = vshufps_avx(auVar82,auVar82,0x55);
  auVar279 = ZEXT1664(auVar117);
  auVar83 = vshufps_avx(auVar82,auVar82,0xaa);
  fVar79 = auVar83._0_4_;
  auVar211._0_4_ = fVar79 * auVar7._0_4_;
  fVar112 = auVar83._4_4_;
  auVar211._4_4_ = fVar112 * auVar7._4_4_;
  fVar113 = auVar83._8_4_;
  auVar211._8_4_ = fVar113 * auVar7._8_4_;
  fVar114 = auVar83._12_4_;
  auVar211._12_4_ = fVar114 * auVar7._12_4_;
  auVar116._0_4_ = auVar10._0_4_ * fVar79;
  auVar116._4_4_ = auVar10._4_4_ * fVar112;
  auVar116._8_4_ = auVar10._8_4_ * fVar113;
  auVar116._12_4_ = auVar10._12_4_ * fVar114;
  auVar83._0_4_ = auVar149._0_4_ * fVar79;
  auVar83._4_4_ = auVar149._4_4_ * fVar112;
  auVar83._8_4_ = auVar149._8_4_ * fVar113;
  auVar83._12_4_ = auVar149._12_4_ * fVar114;
  auVar6 = vfmadd231ps_fma(auVar211,auVar117,auVar6);
  auVar7 = vfmadd231ps_fma(auVar116,auVar117,auVar9);
  auVar9 = vfmadd231ps_fma(auVar83,auVar117,auVar84);
  auVar10 = vfmadd231ps_fma(auVar6,auVar273,auVar5);
  auVar84 = vfmadd231ps_fma(auVar7,auVar273,auVar8);
  auVar149 = vfmadd231ps_fma(auVar9,auVar273,auVar85);
  auVar231._8_4_ = 0x7fffffff;
  auVar231._0_8_ = 0x7fffffff7fffffff;
  auVar231._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar91,auVar231);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar192,1);
  auVar6 = vblendvps_avx(auVar91,auVar192,auVar5);
  auVar5 = vandps_avx(auVar118,auVar231);
  auVar5 = vcmpps_avx(auVar5,auVar192,1);
  auVar7 = vblendvps_avx(auVar118,auVar192,auVar5);
  auVar5 = vandps_avx(auVar193,auVar231);
  auVar5 = vcmpps_avx(auVar5,auVar192,1);
  auVar5 = vblendvps_avx(auVar193,auVar192,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar232._8_4_ = 0x3f800000;
  auVar232._0_8_ = 0x3f8000003f800000;
  auVar232._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar232);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar232);
  auVar9 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar232);
  auVar85 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar193._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar193._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar193._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar193._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar73 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar212._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar212._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar212._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar212._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar118._1_3_ = 0;
  auVar118[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar73 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar84);
  auVar240._0_4_ = auVar5._0_4_ * auVar9._0_4_;
  auVar240._4_4_ = auVar5._4_4_ * auVar9._4_4_;
  auVar240._8_4_ = auVar5._8_4_ * auVar9._8_4_;
  auVar240._12_4_ = auVar5._12_4_ * auVar9._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar84);
  auVar117._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar117._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar117._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar117._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar75 + uVar73 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar149);
  auVar91._0_4_ = auVar85._0_4_ * auVar5._0_4_;
  auVar91._4_4_ = auVar85._4_4_ * auVar5._4_4_;
  auVar91._8_4_ = auVar85._8_4_ * auVar5._8_4_;
  auVar91._12_4_ = auVar85._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar149);
  auVar84._0_4_ = auVar85._0_4_ * auVar5._0_4_;
  auVar84._4_4_ = auVar85._4_4_ * auVar5._4_4_;
  auVar84._8_4_ = auVar85._8_4_ * auVar5._8_4_;
  auVar84._12_4_ = auVar85._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar193,auVar212);
  auVar6 = vpminsd_avx(auVar240,auVar117);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar91,auVar84);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar245._4_4_ = uVar80;
  auVar245._0_4_ = uVar80;
  auVar245._8_4_ = uVar80;
  auVar245._12_4_ = uVar80;
  auVar6 = vmaxps_avx(auVar6,auVar245);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_520._0_4_ = auVar5._0_4_ * 0.99999964;
  local_520._4_4_ = auVar5._4_4_ * 0.99999964;
  local_520._8_4_ = auVar5._8_4_ * 0.99999964;
  local_520._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar193,auVar212);
  auVar6 = vpmaxsd_avx(auVar240,auVar117);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar91,auVar84);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar149._4_4_ = uVar80;
  auVar149._0_4_ = uVar80;
  auVar149._8_4_ = uVar80;
  auVar149._12_4_ = uVar80;
  auVar6 = vminps_avx(auVar6,auVar149);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar85._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar85._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar85._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar85._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar118[4] = PVar1;
  auVar118._5_3_ = 0;
  auVar118[8] = PVar1;
  auVar118._9_3_ = 0;
  auVar118[0xc] = PVar1;
  auVar118._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar118,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_520,auVar85,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar69 = vmovmskps_avx(auVar5);
  if (uVar69 == 0) {
    return false;
  }
  auVar95._16_16_ = mm_lookupmask_ps._240_16_;
  auVar95._0_16_ = mm_lookupmask_ps._240_16_;
  uVar69 = uVar69 & 0xff;
  local_4a0 = vblendps_avx(auVar95,ZEXT832(0) << 0x20,0x80);
  local_820 = 0x7fffffff;
  uStack_81c = 0x7fffffff;
  uStack_818 = 0x7fffffff;
  uStack_814 = 0x7fffffff;
  uStack_810 = 0x7fffffff;
  uStack_80c = 0x7fffffff;
  uStack_808 = 0x7fffffff;
  uStack_804 = 0x7fffffff;
  local_620 = 0x80000000;
  uStack_61c = 0x80000000;
  uStack_618 = 0x80000000;
  uStack_614 = 0x80000000;
  fStack_610 = -0.0;
  fStack_60c = -0.0;
  fStack_608 = -0.0;
  uStack_604 = 0x80000000;
  local_890 = prim;
LAB_015e0f7e:
  lVar22 = 0;
  local_888 = (ulong)uVar69;
  for (uVar75 = local_888; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar69 = *(uint *)(local_890 + 2);
  local_700 = *(uint *)(local_890 + lVar22 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar69].ptr;
  lVar22 = *(long *)&pGVar2[1].time_range.upper;
  uVar75 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           (ulong)local_700 *
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar5 = *(undefined1 (*) [16])(lVar22 + (long)pGVar2[1].intersectionFilterN * uVar75);
  auVar6 = *(undefined1 (*) [16])(lVar22 + (long)pGVar2[1].intersectionFilterN * (uVar75 + 1));
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar274._4_4_ = uVar80;
  auVar274._0_4_ = uVar80;
  auVar274._8_4_ = uVar80;
  auVar274._12_4_ = uVar80;
  fStack_7d0 = (float)uVar80;
  _local_7e0 = auVar274;
  fStack_7cc = (float)uVar80;
  fStack_7c8 = (float)uVar80;
  register0x0000159c = uVar80;
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar260._4_4_ = uVar80;
  auVar260._0_4_ = uVar80;
  auVar260._8_4_ = uVar80;
  auVar260._12_4_ = uVar80;
  fStack_9b0 = (float)uVar80;
  _local_9c0 = auVar260;
  fStack_9ac = (float)uVar80;
  fStack_9a8 = (float)uVar80;
  register0x000014dc = uVar80;
  auVar7 = vunpcklps_avx(auVar274,auVar260);
  fVar79 = *(float *)(ray + k * 4 + 0x60);
  auVar269._4_4_ = fVar79;
  auVar269._0_4_ = fVar79;
  auVar269._8_4_ = fVar79;
  auVar269._12_4_ = fVar79;
  fStack_970 = fVar79;
  _local_980 = auVar269;
  fStack_96c = fVar79;
  fStack_968 = fVar79;
  uStack_964 = fVar79;
  local_930 = vinsertps_avx(auVar7,auVar269,0x28);
  auVar213._8_4_ = 0xbeaaaaab;
  auVar213._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar213._12_4_ = 0xbeaaaaab;
  auVar85 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar2[2].intersectionFilterN +
                              uVar75 * (long)pGVar2[2].pointQueryFunc),auVar5,auVar213);
  auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar2[2].intersectionFilterN +
                             (long)pGVar2[2].pointQueryFunc * (uVar75 + 1)),auVar6,auVar213);
  auVar214._0_4_ = (auVar6._0_4_ + auVar5._0_4_ + auVar85._0_4_ + auVar10._0_4_) * 0.25;
  auVar214._4_4_ = (auVar6._4_4_ + auVar5._4_4_ + auVar85._4_4_ + auVar10._4_4_) * 0.25;
  auVar214._8_4_ = (auVar6._8_4_ + auVar5._8_4_ + auVar85._8_4_ + auVar10._8_4_) * 0.25;
  auVar214._12_4_ = (auVar6._12_4_ + auVar5._12_4_ + auVar85._12_4_ + auVar10._12_4_) * 0.25;
  auVar7 = vsubps_avx(auVar214,auVar8);
  auVar7 = vdpps_avx(auVar7,local_930,0x7f);
  local_940 = vdpps_avx(local_930,local_930,0x7f);
  auVar247 = ZEXT1664(local_940);
  auVar9 = vrcpss_avx(local_940,local_940);
  auVar84 = vfnmadd213ss_fma(auVar9,local_940,ZEXT416(0x40000000));
  local_360 = auVar7._0_4_ * auVar9._0_4_ * auVar84._0_4_;
  auVar226._4_4_ = local_360;
  auVar226._0_4_ = local_360;
  auVar226._8_4_ = local_360;
  auVar226._12_4_ = local_360;
  fStack_910 = local_360;
  _local_920 = auVar226;
  fStack_90c = local_360;
  fStack_908 = local_360;
  fStack_904 = local_360;
  auVar7 = vfmadd231ps_fma(auVar8,local_930,auVar226);
  auVar7 = vblendps_avx(auVar7,_DAT_01f7aa10,8);
  auVar8 = vsubps_avx(auVar5,auVar7);
  auVar9 = vsubps_avx(auVar10,auVar7);
  auVar10 = vsubps_avx(auVar85,auVar7);
  auVar85 = vsubps_avx(auVar6,auVar7);
  auVar5 = vmovshdup_avx(auVar8);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  uVar81 = auVar5._0_8_;
  auVar219._8_8_ = uVar81;
  auVar219._0_8_ = uVar81;
  auVar219._16_8_ = uVar81;
  auVar219._24_8_ = uVar81;
  auVar5 = vmovshdup_avx(auVar10);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar6 = vshufps_avx(auVar10,auVar10,0xaa);
  uVar81 = auVar6._0_8_;
  auVar265._8_8_ = uVar81;
  auVar265._0_8_ = uVar81;
  auVar265._16_8_ = uVar81;
  auVar265._24_8_ = uVar81;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  uVar81 = auVar5._0_8_;
  local_2e0._8_8_ = uVar81;
  local_2e0._0_8_ = uVar81;
  local_2e0._16_8_ = uVar81;
  local_2e0._24_8_ = uVar81;
  auVar5 = vmovshdup_avx(auVar9);
  local_440 = auVar5._0_4_;
  fStack_43c = auVar5._4_4_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_460 = auVar5._0_4_;
  fStack_45c = auVar5._4_4_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_480 = auVar5._0_4_;
  fStack_47c = auVar5._4_4_;
  auVar5 = vmovshdup_avx(auVar85);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vshufps_avx(auVar85,auVar85,0xaa);
  local_260 = auVar5._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar5 = vshufps_avx(auVar85,auVar85,0xff);
  local_280 = auVar5._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar79 * fVar79)),_local_9c0,_local_9c0);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_7e0,_local_7e0);
  uVar80 = auVar5._0_4_;
  local_2a0._4_4_ = uVar80;
  local_2a0._0_4_ = uVar80;
  local_2a0._8_4_ = uVar80;
  local_2a0._12_4_ = uVar80;
  local_2a0._16_4_ = uVar80;
  local_2a0._20_4_ = uVar80;
  local_2a0._24_4_ = uVar80;
  local_2a0._28_4_ = uVar80;
  auVar262 = ZEXT3264(local_2a0);
  fVar79 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)local_360);
  local_360 = fVar79 - local_360;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  uVar75 = 0;
  bVar76 = false;
  local_bc8 = 1;
  local_300._0_4_ = auVar8._0_4_;
  local_300._4_4_ = local_300._0_4_;
  local_300._8_4_ = local_300._0_4_;
  local_300._12_4_ = local_300._0_4_;
  local_300._16_4_ = local_300._0_4_;
  local_300._20_4_ = local_300._0_4_;
  local_300._24_4_ = local_300._0_4_;
  local_300._28_4_ = local_300._0_4_;
  fVar113 = auVar10._0_4_;
  auVar250._4_4_ = fVar113;
  auVar250._0_4_ = fVar113;
  auVar250._8_4_ = fVar113;
  auVar250._12_4_ = fVar113;
  auVar250._16_4_ = fVar113;
  auVar250._20_4_ = fVar113;
  auVar250._24_4_ = fVar113;
  auVar250._28_4_ = fVar113;
  fVar114 = auVar9._0_4_;
  local_320._4_4_ = fVar114;
  local_320._0_4_ = fVar114;
  local_320._8_4_ = fVar114;
  local_320._12_4_ = fVar114;
  local_320._16_4_ = fVar114;
  local_320._20_4_ = fVar114;
  local_320._24_4_ = fVar114;
  local_320._28_4_ = fVar114;
  fVar112 = auVar85._0_4_;
  auVar98._4_4_ = uStack_81c;
  auVar98._0_4_ = local_820;
  auVar98._8_4_ = uStack_818;
  auVar98._12_4_ = uStack_814;
  auVar98._16_4_ = uStack_810;
  auVar98._20_4_ = uStack_80c;
  auVar98._24_4_ = uStack_808;
  auVar98._28_4_ = uStack_804;
  local_4e0 = vandps_avx(local_2a0,auVar98);
  auVar5 = vsqrtss_avx(local_940,local_940);
  auVar7 = vsqrtss_avx(local_940,local_940);
  local_510 = ZEXT816(0x3f80000000000000);
  local_340 = fVar112;
  fStack_33c = fVar112;
  fStack_338 = fVar112;
  fStack_334 = fVar112;
  fStack_330 = fVar112;
  fStack_32c = fVar112;
  fStack_328 = fVar112;
  fStack_324 = fVar112;
  uStack_6fc = local_700;
  uStack_6f8 = local_700;
  uStack_6f4 = local_700;
  local_6f0 = uVar69;
  uStack_6ec = uVar69;
  uStack_6e8 = uVar69;
  uStack_6e4 = uVar69;
  local_4c0 = auVar219;
  fStack_478 = local_480;
  fStack_474 = fStack_47c;
  fStack_470 = local_480;
  fStack_46c = fStack_47c;
  fStack_468 = local_480;
  fStack_464 = fStack_47c;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar201._8_4_ = 0x3f800000;
    auVar201._0_8_ = 0x3f8000003f800000;
    auVar201._12_4_ = 0x3f800000;
    auVar201._16_4_ = 0x3f800000;
    auVar201._20_4_ = 0x3f800000;
    iVar74 = (int)uVar75;
    auVar201._24_4_ = 0x3f800000;
    auVar201._28_4_ = 0x3f800000;
    auVar84 = vmovshdup_avx(local_510);
    auVar84 = vsubps_avx(auVar84,local_510);
    fVar143 = auVar84._0_4_;
    fVar147 = fVar143 * 0.04761905;
    local_9a0._0_4_ = local_510._0_4_;
    local_9a0._4_4_ = local_9a0._0_4_;
    local_9a0._8_4_ = local_9a0._0_4_;
    local_9a0._12_4_ = local_9a0._0_4_;
    local_9a0._16_4_ = local_9a0._0_4_;
    local_9a0._20_4_ = local_9a0._0_4_;
    local_9a0._24_4_ = local_9a0._0_4_;
    local_9a0._28_4_ = local_9a0._0_4_;
    local_760._4_4_ = fVar143;
    local_760._0_4_ = fVar143;
    local_760._8_4_ = fVar143;
    local_760._12_4_ = fVar143;
    local_760._16_4_ = fVar143;
    local_760._20_4_ = fVar143;
    local_760._24_4_ = fVar143;
    local_760._28_4_ = fVar143;
    auVar84 = vfmadd231ps_fma(local_9a0,local_760,_DAT_01faff20);
    auVar95 = vsubps_avx(auVar201,ZEXT1632(auVar84));
    fVar115 = auVar84._0_4_;
    auVar137._0_4_ = fVar113 * fVar115;
    fVar139 = auVar84._4_4_;
    auVar137._4_4_ = fVar113 * fVar139;
    fVar140 = auVar84._8_4_;
    auVar137._8_4_ = fVar113 * fVar140;
    fVar141 = auVar84._12_4_;
    auVar137._12_4_ = fVar113 * fVar141;
    auVar137._16_4_ = fVar113 * 0.0;
    auVar137._20_4_ = fVar113 * 0.0;
    auVar137._28_36_ = auVar262._28_36_;
    auVar137._24_4_ = fVar113 * 0.0;
    auVar64._8_8_ = uStack_218;
    auVar64._0_8_ = local_220;
    auVar64._16_8_ = uStack_210;
    auVar64._24_8_ = uStack_208;
    auVar262._0_4_ = (float)local_220 * fVar115;
    auVar262._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar139;
    auVar262._8_4_ = (float)uStack_218 * fVar140;
    auVar262._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar141;
    auVar262._16_4_ = (float)uStack_210 * 0.0;
    auVar262._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar262._28_36_ = auVar247._28_36_;
    auVar262._24_4_ = (float)uStack_208 * 0.0;
    fVar145 = auVar6._0_4_;
    auVar247._0_4_ = fVar145 * fVar115;
    fVar142 = auVar6._4_4_;
    auVar247._4_4_ = fVar142 * fVar139;
    auVar247._8_4_ = fVar145 * fVar140;
    auVar247._12_4_ = fVar142 * fVar141;
    auVar247._16_4_ = fVar145 * 0.0;
    auVar247._20_4_ = fVar142 * 0.0;
    auVar247._28_36_ = auVar279._28_36_;
    auVar247._24_4_ = fVar145 * 0.0;
    auVar252._4_4_ = local_2e0._4_4_ * fVar139;
    auVar252._0_4_ = local_2e0._0_4_ * fVar115;
    auVar252._8_4_ = local_2e0._8_4_ * fVar140;
    auVar252._12_4_ = local_2e0._12_4_ * fVar141;
    auVar252._16_4_ = local_2e0._16_4_ * 0.0;
    auVar252._20_4_ = local_2e0._20_4_ * 0.0;
    auVar252._24_4_ = local_2e0._24_4_ * 0.0;
    auVar252._28_4_ = fVar143;
    auVar84 = vfmadd231ps_fma(auVar137._0_32_,auVar95,local_300);
    auVar66._8_8_ = uStack_1d8;
    auVar66._0_8_ = local_1e0;
    auVar66._16_8_ = uStack_1d0;
    auVar66._24_8_ = uStack_1c8;
    auVar149 = vfmadd231ps_fma(auVar262._0_32_,auVar95,auVar66);
    auVar65._8_8_ = uStack_1f8;
    auVar65._0_8_ = local_200;
    auVar65._16_8_ = uStack_1f0;
    auVar65._24_8_ = uStack_1e8;
    auVar117 = vfmadd231ps_fma(auVar247._0_32_,auVar95,auVar65);
    auVar83 = vfmadd231ps_fma(auVar252,auVar95,auVar219);
    auVar13._4_4_ = local_320._4_4_ * fVar139;
    auVar13._0_4_ = local_320._0_4_ * fVar115;
    auVar13._8_4_ = local_320._8_4_ * fVar140;
    auVar13._12_4_ = local_320._12_4_ * fVar141;
    auVar13._16_4_ = local_320._16_4_ * 0.0;
    auVar13._20_4_ = local_320._20_4_ * 0.0;
    auVar13._24_4_ = local_320._24_4_ * 0.0;
    auVar13._28_4_ = local_320._28_4_;
    auVar181._4_4_ = fVar139 * fStack_43c;
    auVar181._0_4_ = fVar115 * local_440;
    auVar181._8_4_ = fVar140 * fStack_438;
    auVar181._12_4_ = fVar141 * fStack_434;
    auVar181._16_4_ = fStack_430 * 0.0;
    auVar181._20_4_ = fStack_42c * 0.0;
    auVar181._24_4_ = fStack_428 * 0.0;
    auVar181._28_4_ = auVar219._28_4_;
    auVar14._4_4_ = fVar139 * fStack_45c;
    auVar14._0_4_ = fVar115 * local_460;
    auVar14._8_4_ = fVar140 * fStack_458;
    auVar14._12_4_ = fVar141 * fStack_454;
    auVar14._16_4_ = fStack_450 * 0.0;
    auVar14._20_4_ = fStack_44c * 0.0;
    auVar14._24_4_ = fStack_448 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar67._4_4_ = fVar139 * fStack_47c;
    auVar67._0_4_ = fVar115 * local_480;
    auVar67._8_4_ = fVar140 * fStack_478;
    auVar67._12_4_ = fVar141 * fStack_474;
    auVar67._16_4_ = fStack_470 * 0.0;
    auVar67._20_4_ = fStack_46c * 0.0;
    auVar67._24_4_ = fStack_468 * 0.0;
    auVar67._28_4_ = DAT_01faff20._28_4_;
    auVar118 = vfmadd231ps_fma(auVar13,auVar95,auVar250);
    auVar91 = vfmadd231ps_fma(auVar181,auVar95,auVar64);
    auVar193 = vfmadd231ps_fma(auVar14,auVar95,auVar265);
    auVar82 = vfmadd231ps_fma(auVar67,auVar95,local_2e0);
    auVar161._4_4_ = fStack_33c * fVar139;
    auVar161._0_4_ = local_340 * fVar115;
    auVar161._8_4_ = fStack_338 * fVar140;
    auVar161._12_4_ = fStack_334 * fVar141;
    auVar161._16_4_ = fStack_330 * 0.0;
    auVar161._20_4_ = fStack_32c * 0.0;
    auVar161._24_4_ = fStack_328 * 0.0;
    auVar161._28_4_ = fStack_324;
    auVar206._4_4_ = fVar139 * local_240._4_4_;
    auVar206._0_4_ = fVar115 * (float)local_240;
    auVar206._8_4_ = fVar140 * (float)uStack_238;
    auVar206._12_4_ = fVar141 * uStack_238._4_4_;
    auVar206._16_4_ = (float)uStack_230 * 0.0;
    auVar206._20_4_ = uStack_230._4_4_ * 0.0;
    auVar206._24_4_ = (float)uStack_228 * 0.0;
    auVar206._28_4_ = fVar142;
    auVar15._28_4_ = local_300._28_4_;
    auVar15._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar141,
                            CONCAT48(auVar118._8_4_ * fVar140,
                                     CONCAT44(auVar118._4_4_ * fVar139,auVar118._0_4_ * fVar115))));
    auVar84 = vfmadd231ps_fma(auVar15,auVar95,ZEXT1632(auVar84));
    auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar91._12_4_,
                                                  CONCAT48(fVar140 * auVar91._8_4_,
                                                           CONCAT44(fVar139 * auVar91._4_4_,
                                                                    fVar115 * auVar91._0_4_)))),
                               auVar95,ZEXT1632(auVar149));
    auVar68._28_4_ = fVar113;
    auVar68._0_28_ =
         ZEXT1628(CONCAT412(fVar141 * auVar193._12_4_,
                            CONCAT48(fVar140 * auVar193._8_4_,
                                     CONCAT44(fVar139 * auVar193._4_4_,fVar115 * auVar193._0_4_))));
    auVar117 = vfmadd231ps_fma(auVar68,auVar95,ZEXT1632(auVar117));
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar82._12_4_,
                                                 CONCAT48(fVar140 * auVar82._8_4_,
                                                          CONCAT44(fVar139 * auVar82._4_4_,
                                                                   fVar115 * auVar82._0_4_)))),
                              auVar95,ZEXT1632(auVar83));
    auVar16._4_4_ = fVar139 * local_260._4_4_;
    auVar16._0_4_ = fVar115 * (float)local_260;
    auVar16._8_4_ = fVar140 * (float)uStack_258;
    auVar16._12_4_ = fVar141 * uStack_258._4_4_;
    auVar16._16_4_ = (float)uStack_250 * 0.0;
    auVar16._20_4_ = uStack_250._4_4_ * 0.0;
    auVar16._24_4_ = (float)uStack_248 * 0.0;
    auVar16._28_4_ = local_2e0._28_4_;
    auVar116 = vfmadd231ps_fma(auVar161,auVar95,local_320);
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar116._12_4_ * fVar141,
                                                  CONCAT48(auVar116._8_4_ * fVar140,
                                                           CONCAT44(auVar116._4_4_ * fVar139,
                                                                    auVar116._0_4_ * fVar115)))),
                               auVar95,ZEXT1632(auVar118));
    auVar243._0_4_ = fVar115 * (float)local_280;
    auVar243._4_4_ = fVar139 * local_280._4_4_;
    auVar243._8_4_ = fVar140 * (float)uStack_278;
    auVar243._12_4_ = fVar141 * uStack_278._4_4_;
    auVar243._16_4_ = (float)uStack_270 * 0.0;
    auVar243._20_4_ = uStack_270._4_4_ * 0.0;
    auVar243._24_4_ = (float)uStack_268 * 0.0;
    auVar243._28_4_ = 0;
    auVar61._4_4_ = fStack_43c;
    auVar61._0_4_ = local_440;
    auVar61._8_4_ = fStack_438;
    auVar61._12_4_ = fStack_434;
    auVar61._16_4_ = fStack_430;
    auVar61._20_4_ = fStack_42c;
    auVar61._24_4_ = fStack_428;
    auVar61._28_4_ = fStack_424;
    auVar116 = vfmadd231ps_fma(auVar206,auVar95,auVar61);
    auVar178._4_4_ = fStack_45c;
    auVar178._0_4_ = local_460;
    auVar178._8_4_ = fStack_458;
    auVar178._12_4_ = fStack_454;
    auVar178._16_4_ = fStack_450;
    auVar178._20_4_ = fStack_44c;
    auVar178._24_4_ = fStack_448;
    auVar178._28_4_ = fStack_444;
    auVar192 = vfmadd231ps_fma(auVar16,auVar95,auVar178);
    auVar96._4_4_ = fStack_47c;
    auVar96._0_4_ = local_480;
    auVar96._8_4_ = fStack_478;
    auVar96._12_4_ = fStack_474;
    auVar96._16_4_ = fStack_470;
    auVar96._20_4_ = fStack_46c;
    auVar96._24_4_ = fStack_468;
    auVar96._28_4_ = fStack_464;
    auVar210 = vfmadd231ps_fma(auVar243,auVar95,auVar96);
    auVar179._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar179._0_28_ =
         ZEXT1628(CONCAT412(auVar210._12_4_ * fVar141,
                            CONCAT48(auVar210._8_4_ * fVar140,
                                     CONCAT44(auVar210._4_4_ * fVar139,auVar210._0_4_ * fVar115))));
    auVar91 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar116._12_4_ * fVar141,
                                                 CONCAT48(auVar116._8_4_ * fVar140,
                                                          CONCAT44(auVar116._4_4_ * fVar139,
                                                                   auVar116._0_4_ * fVar115)))),
                              auVar95,ZEXT1632(auVar91));
    auVar193 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar192._12_4_,
                                                  CONCAT48(fVar140 * auVar192._8_4_,
                                                           CONCAT44(fVar139 * auVar192._4_4_,
                                                                    fVar115 * auVar192._0_4_)))),
                               auVar95,ZEXT1632(auVar193));
    auVar82 = vfmadd231ps_fma(auVar179,auVar95,ZEXT1632(auVar82));
    auVar17._28_4_ = local_320._28_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar91._12_4_ * fVar141,
                            CONCAT48(auVar91._8_4_ * fVar140,
                                     CONCAT44(auVar91._4_4_ * fVar139,auVar91._0_4_ * fVar115))));
    auVar116 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar118._12_4_ * fVar141,
                                                  CONCAT48(auVar118._8_4_ * fVar140,
                                                           CONCAT44(auVar118._4_4_ * fVar139,
                                                                    auVar118._0_4_ * fVar115)))),
                               auVar95,ZEXT1632(auVar84));
    auVar192 = vfmadd231ps_fma(auVar17,auVar95,ZEXT1632(auVar149));
    auVar96 = ZEXT1632(auVar192);
    auVar192 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar141 * auVar193._12_4_,
                                                  CONCAT48(fVar140 * auVar193._8_4_,
                                                           CONCAT44(fVar139 * auVar193._4_4_,
                                                                    fVar115 * auVar193._0_4_)))),
                               auVar95,ZEXT1632(auVar117));
    auVar210 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar82._12_4_ * fVar141,
                                                  CONCAT48(auVar82._8_4_ * fVar140,
                                                           CONCAT44(auVar82._4_4_ * fVar139,
                                                                    auVar82._0_4_ * fVar115)))),
                               ZEXT1632(auVar83),auVar95);
    auVar219 = vsubps_avx(ZEXT1632(auVar118),ZEXT1632(auVar84));
    auVar95 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar149));
    auVar98 = vsubps_avx(ZEXT1632(auVar193),ZEXT1632(auVar117));
    auVar252 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar83));
    local_720._0_4_ = fVar147 * auVar219._0_4_ * 3.0;
    local_720._4_4_ = fVar147 * auVar219._4_4_ * 3.0;
    local_720._8_4_ = fVar147 * auVar219._8_4_ * 3.0;
    local_720._12_4_ = fVar147 * auVar219._12_4_ * 3.0;
    local_720._16_4_ = fVar147 * auVar219._16_4_ * 3.0;
    local_720._20_4_ = fVar147 * auVar219._20_4_ * 3.0;
    local_720._24_4_ = fVar147 * auVar219._24_4_ * 3.0;
    local_720._28_4_ = 0;
    auVar246._0_4_ = fVar147 * auVar95._0_4_ * 3.0;
    auVar246._4_4_ = fVar147 * auVar95._4_4_ * 3.0;
    auVar246._8_4_ = fVar147 * auVar95._8_4_ * 3.0;
    auVar246._12_4_ = fVar147 * auVar95._12_4_ * 3.0;
    auVar246._16_4_ = fVar147 * auVar95._16_4_ * 3.0;
    auVar246._20_4_ = fVar147 * auVar95._20_4_ * 3.0;
    auVar246._24_4_ = fVar147 * auVar95._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    auVar270._0_4_ = fVar147 * auVar98._0_4_ * 3.0;
    auVar270._4_4_ = fVar147 * auVar98._4_4_ * 3.0;
    auVar270._8_4_ = fVar147 * auVar98._8_4_ * 3.0;
    auVar270._12_4_ = fVar147 * auVar98._12_4_ * 3.0;
    auVar270._16_4_ = fVar147 * auVar98._16_4_ * 3.0;
    auVar270._20_4_ = fVar147 * auVar98._20_4_ * 3.0;
    auVar270._24_4_ = fVar147 * auVar98._24_4_ * 3.0;
    auVar270._28_4_ = 0;
    fVar115 = fVar147 * auVar252._0_4_ * 3.0;
    fVar139 = fVar147 * auVar252._4_4_ * 3.0;
    auVar19._4_4_ = fVar139;
    auVar19._0_4_ = fVar115;
    fVar140 = fVar147 * auVar252._8_4_ * 3.0;
    auVar19._8_4_ = fVar140;
    fVar141 = fVar147 * auVar252._12_4_ * 3.0;
    auVar19._12_4_ = fVar141;
    fVar143 = fVar147 * auVar252._16_4_ * 3.0;
    auVar19._16_4_ = fVar143;
    fVar145 = fVar147 * auVar252._20_4_ * 3.0;
    auVar19._20_4_ = fVar145;
    fVar147 = fVar147 * auVar252._24_4_ * 3.0;
    auVar19._24_4_ = fVar147;
    auVar19._28_4_ = auVar219._28_4_;
    auVar178 = ZEXT1632(auVar116);
    auVar179 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar116));
    _local_900 = vpermps_avx2(_DAT_01fec480,auVar96);
    auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar192));
    auVar13 = vsubps_avx(auVar179,auVar178);
    auVar181 = vsubps_avx(auVar17,ZEXT1632(auVar192));
    fVar142 = auVar181._0_4_;
    fVar144 = auVar181._4_4_;
    auVar18._4_4_ = fVar144 * local_720._4_4_;
    auVar18._0_4_ = fVar142 * local_720._0_4_;
    fVar146 = auVar181._8_4_;
    auVar18._8_4_ = fVar146 * local_720._8_4_;
    fVar148 = auVar181._12_4_;
    auVar18._12_4_ = fVar148 * local_720._12_4_;
    fVar190 = auVar181._16_4_;
    auVar18._16_4_ = fVar190 * local_720._16_4_;
    fVar191 = auVar181._20_4_;
    auVar18._20_4_ = fVar191 * local_720._20_4_;
    fVar238 = auVar181._24_4_;
    auVar18._24_4_ = fVar238 * local_720._24_4_;
    auVar18._28_4_ = auVar179._28_4_;
    auVar84 = vfmsub231ps_fma(auVar18,auVar270,auVar13);
    auVar14 = vsubps_avx(_local_900,auVar96);
    fVar248 = auVar13._0_4_;
    fVar253 = auVar13._4_4_;
    auVar20._4_4_ = fVar253 * auVar246._4_4_;
    auVar20._0_4_ = fVar248 * auVar246._0_4_;
    fVar254 = auVar13._8_4_;
    auVar20._8_4_ = fVar254 * auVar246._8_4_;
    fVar255 = auVar13._12_4_;
    auVar20._12_4_ = fVar255 * auVar246._12_4_;
    fVar256 = auVar13._16_4_;
    auVar20._16_4_ = fVar256 * auVar246._16_4_;
    fVar257 = auVar13._20_4_;
    auVar20._20_4_ = fVar257 * auVar246._20_4_;
    fVar258 = auVar13._24_4_;
    auVar20._24_4_ = fVar258 * auVar246._24_4_;
    auVar20._28_4_ = local_900._28_4_;
    auVar149 = vfmsub231ps_fma(auVar20,local_720,auVar14);
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar149._12_4_ * auVar149._12_4_,
                                                 CONCAT48(auVar149._8_4_ * auVar149._8_4_,
                                                          CONCAT44(auVar149._4_4_ * auVar149._4_4_,
                                                                   auVar149._0_4_ * auVar149._0_4_))
                                                )),ZEXT1632(auVar84),ZEXT1632(auVar84));
    fVar167 = auVar14._0_4_;
    fVar186 = auVar14._4_4_;
    auVar99._4_4_ = fVar186 * auVar270._4_4_;
    auVar99._0_4_ = fVar167 * auVar270._0_4_;
    fVar187 = auVar14._8_4_;
    auVar99._8_4_ = fVar187 * auVar270._8_4_;
    fVar188 = auVar14._12_4_;
    auVar99._12_4_ = fVar188 * auVar270._12_4_;
    fVar189 = auVar14._16_4_;
    auVar99._16_4_ = fVar189 * auVar270._16_4_;
    fVar263 = auVar14._20_4_;
    auVar99._20_4_ = fVar263 * auVar270._20_4_;
    fVar264 = auVar14._24_4_;
    auVar99._24_4_ = fVar264 * auVar270._24_4_;
    auVar99._28_4_ = auVar17._28_4_;
    auVar117 = vfmsub231ps_fma(auVar99,auVar246,auVar181);
    auVar160._0_4_ = fVar142 * fVar142;
    auVar160._4_4_ = fVar144 * fVar144;
    auVar160._8_4_ = fVar146 * fVar146;
    auVar160._12_4_ = fVar148 * fVar148;
    auVar160._16_4_ = fVar190 * fVar190;
    auVar160._20_4_ = fVar191 * fVar191;
    auVar160._24_4_ = fVar238 * fVar238;
    auVar160._28_4_ = 0;
    auVar149 = vfmadd231ps_fma(auVar160,auVar14,auVar14);
    auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar13,auVar13);
    auVar95 = vrcpps_avx(ZEXT1632(auVar149));
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar117),ZEXT1632(auVar117));
    auVar266._8_4_ = 0x3f800000;
    auVar266._0_8_ = 0x3f8000003f800000;
    auVar266._12_4_ = 0x3f800000;
    auVar266._16_4_ = 0x3f800000;
    auVar266._20_4_ = 0x3f800000;
    auVar266._24_4_ = 0x3f800000;
    auVar266._28_4_ = 0x3f800000;
    auVar84 = vfnmadd213ps_fma(auVar95,ZEXT1632(auVar149),auVar266);
    auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar95,auVar95);
    auVar18 = vpermps_avx2(_DAT_01fec480,local_720);
    local_960 = vpermps_avx2(_DAT_01fec480,auVar270);
    auVar261._4_4_ = auVar18._4_4_ * fVar144;
    auVar261._0_4_ = auVar18._0_4_ * fVar142;
    auVar261._8_4_ = auVar18._8_4_ * fVar146;
    auVar261._12_4_ = auVar18._12_4_ * fVar148;
    auVar261._16_4_ = auVar18._16_4_ * fVar190;
    auVar261._20_4_ = auVar18._20_4_ * fVar191;
    auVar261._24_4_ = auVar18._24_4_ * fVar238;
    auVar261._28_4_ = auVar95._28_4_;
    auVar83 = vfmsub231ps_fma(auVar261,local_960,auVar13);
    local_740 = vpermps_avx2(_DAT_01fec480,auVar246);
    auVar277._4_4_ = fVar253 * local_740._4_4_;
    auVar277._0_4_ = fVar248 * local_740._0_4_;
    auVar277._8_4_ = fVar254 * local_740._8_4_;
    auVar277._12_4_ = fVar255 * local_740._12_4_;
    auVar277._16_4_ = fVar256 * local_740._16_4_;
    auVar277._20_4_ = fVar257 * local_740._20_4_;
    auVar277._24_4_ = fVar258 * local_740._24_4_;
    auVar277._28_4_ = 0;
    auVar118 = vfmsub231ps_fma(auVar277,auVar18,auVar14);
    auVar83 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar118._12_4_ * auVar118._12_4_,
                                                 CONCAT48(auVar118._8_4_ * auVar118._8_4_,
                                                          CONCAT44(auVar118._4_4_ * auVar118._4_4_,
                                                                   auVar118._0_4_ * auVar118._0_4_))
                                                )),ZEXT1632(auVar83),ZEXT1632(auVar83));
    auVar220._0_4_ = fVar167 * local_960._0_4_;
    auVar220._4_4_ = fVar186 * local_960._4_4_;
    auVar220._8_4_ = fVar187 * local_960._8_4_;
    auVar220._12_4_ = fVar188 * local_960._12_4_;
    auVar220._16_4_ = fVar189 * local_960._16_4_;
    auVar220._20_4_ = fVar263 * local_960._20_4_;
    auVar220._24_4_ = fVar264 * local_960._24_4_;
    auVar220._28_4_ = 0;
    auVar118 = vfmsub231ps_fma(auVar220,local_740,auVar181);
    auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar118),ZEXT1632(auVar118));
    auVar95 = vmaxps_avx(ZEXT1632(CONCAT412(auVar117._12_4_ * auVar84._12_4_,
                                            CONCAT48(auVar117._8_4_ * auVar84._8_4_,
                                                     CONCAT44(auVar117._4_4_ * auVar84._4_4_,
                                                              auVar117._0_4_ * auVar84._0_4_)))),
                         ZEXT1632(CONCAT412(auVar83._12_4_ * auVar84._12_4_,
                                            CONCAT48(auVar83._8_4_ * auVar84._8_4_,
                                                     CONCAT44(auVar83._4_4_ * auVar84._4_4_,
                                                              auVar83._0_4_ * auVar84._0_4_)))));
    local_7a0._0_4_ = auVar210._0_4_ + fVar115;
    local_7a0._4_4_ = auVar210._4_4_ + fVar139;
    local_7a0._8_4_ = auVar210._8_4_ + fVar140;
    local_7a0._12_4_ = auVar210._12_4_ + fVar141;
    local_7a0._16_4_ = fVar143 + 0.0;
    local_7a0._20_4_ = fVar145 + 0.0;
    local_7a0._24_4_ = fVar147 + 0.0;
    local_7a0._28_4_ = auVar219._28_4_ + 0.0;
    local_780 = ZEXT1632(auVar210);
    auVar219 = vsubps_avx(local_780,auVar19);
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar219);
    auStack_7b0 = auVar19._16_16_;
    auVar20 = vpermps_avx2(_DAT_01fec480,local_780);
    auVar219 = vmaxps_avx(local_780,local_7a0);
    auVar98 = vmaxps_avx(auVar19,auVar20);
    auVar252 = vrsqrtps_avx(ZEXT1632(auVar149));
    auVar219 = vmaxps_avx(auVar219,auVar98);
    fVar115 = auVar252._0_4_;
    fVar139 = auVar252._4_4_;
    fVar140 = auVar252._8_4_;
    fVar141 = auVar252._12_4_;
    fVar147 = auVar252._16_4_;
    fVar143 = auVar252._20_4_;
    fVar145 = auVar252._24_4_;
    auVar4._4_4_ = fVar139 * fVar139 * fVar139 * auVar149._4_4_ * -0.5;
    auVar4._0_4_ = fVar115 * fVar115 * fVar115 * auVar149._0_4_ * -0.5;
    auVar4._8_4_ = fVar140 * fVar140 * fVar140 * auVar149._8_4_ * -0.5;
    auVar4._12_4_ = fVar141 * fVar141 * fVar141 * auVar149._12_4_ * -0.5;
    auVar4._16_4_ = fVar147 * fVar147 * fVar147 * -0.0;
    auVar4._20_4_ = fVar143 * fVar143 * fVar143 * -0.0;
    auVar4._24_4_ = fVar145 * fVar145 * fVar145 * -0.0;
    auVar4._28_4_ = local_740._28_4_;
    auVar97._8_4_ = 0x3fc00000;
    auVar97._0_8_ = 0x3fc000003fc00000;
    auVar97._12_4_ = 0x3fc00000;
    auVar97._16_4_ = 0x3fc00000;
    auVar97._20_4_ = 0x3fc00000;
    auVar97._24_4_ = 0x3fc00000;
    auVar97._28_4_ = 0x3fc00000;
    auVar84 = vfmadd231ps_fma(auVar4,auVar97,auVar252);
    auVar247 = ZEXT1664(auVar84);
    fVar139 = auVar84._0_4_;
    fVar140 = auVar84._4_4_;
    auVar11._4_4_ = fVar186 * fVar140;
    auVar11._0_4_ = fVar167 * fVar139;
    fVar147 = auVar84._8_4_;
    auVar11._8_4_ = fVar187 * fVar147;
    fVar145 = auVar84._12_4_;
    auVar11._12_4_ = fVar188 * fVar145;
    auVar11._16_4_ = fVar189 * 0.0;
    auVar11._20_4_ = fVar263 * 0.0;
    uVar80 = auVar252._28_4_;
    auVar11._24_4_ = fVar264 * 0.0;
    auVar11._28_4_ = uVar80;
    auVar12._4_4_ = (float)local_980._4_4_ * fVar140 * fVar144;
    auVar12._0_4_ = (float)local_980._0_4_ * fVar139 * fVar142;
    auVar12._8_4_ = fStack_978 * fVar147 * fVar146;
    auVar12._12_4_ = fStack_974 * fVar145 * fVar148;
    auVar12._16_4_ = fStack_970 * fVar190 * 0.0;
    auVar12._20_4_ = fStack_96c * fVar191 * 0.0;
    auVar12._24_4_ = fStack_968 * fVar238 * 0.0;
    auVar12._28_4_ = auVar14._28_4_;
    auVar84 = vfmadd231ps_fma(auVar12,auVar11,_local_9c0);
    auVar277 = ZEXT1632(auVar192);
    auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar252 = vsubps_avx(auVar98,auVar277);
    fVar167 = auVar252._0_4_;
    auVar278._0_4_ = fVar167 * fVar139 * fVar142;
    fVar186 = auVar252._4_4_;
    auVar278._4_4_ = fVar186 * fVar140 * fVar144;
    fVar187 = auVar252._8_4_;
    auVar278._8_4_ = fVar187 * fVar147 * fVar146;
    fVar188 = auVar252._12_4_;
    auVar278._12_4_ = fVar188 * fVar145 * fVar148;
    fVar189 = auVar252._16_4_;
    auVar278._16_4_ = fVar189 * fVar190 * 0.0;
    fVar190 = auVar252._20_4_;
    auVar278._20_4_ = fVar190 * fVar191 * 0.0;
    fVar191 = auVar252._24_4_;
    auVar278._24_4_ = fVar191 * fVar238 * 0.0;
    auVar278._28_4_ = 0;
    auVar161 = vsubps_avx(auVar98,auVar96);
    auVar149 = vfmadd231ps_fma(auVar278,auVar161,auVar11);
    auVar23._4_4_ = fVar253 * fVar140;
    auVar23._0_4_ = fVar248 * fVar139;
    auVar23._8_4_ = fVar254 * fVar147;
    auVar23._12_4_ = fVar255 * fVar145;
    auVar23._16_4_ = fVar256 * 0.0;
    auVar23._20_4_ = fVar257 * 0.0;
    auVar23._24_4_ = fVar258 * 0.0;
    auVar23._28_4_ = uVar80;
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar23,_local_7e0);
    auVar262 = ZEXT1664(auVar84);
    auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar206 = vsubps_avx(auVar99,auVar178);
    auVar149 = vfmadd231ps_fma(ZEXT1632(auVar149),auVar206,auVar23);
    auVar279 = ZEXT1664(auVar149);
    auVar24._4_4_ = (float)local_980._4_4_ * fVar186;
    auVar24._0_4_ = (float)local_980._0_4_ * fVar167;
    auVar24._8_4_ = fStack_978 * fVar187;
    auVar24._12_4_ = fStack_974 * fVar188;
    auVar24._16_4_ = fStack_970 * fVar189;
    auVar24._20_4_ = fStack_96c * fVar190;
    auVar24._24_4_ = fStack_968 * fVar191;
    auVar24._28_4_ = uVar80;
    auVar117 = vfmadd231ps_fma(auVar24,_local_9c0,auVar161);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),_local_7e0,auVar206);
    fVar115 = auVar149._0_4_;
    fVar238 = auVar84._0_4_;
    fVar141 = auVar149._4_4_;
    fVar248 = auVar84._4_4_;
    fVar143 = auVar149._8_4_;
    fVar253 = auVar84._8_4_;
    fVar142 = auVar149._12_4_;
    fVar254 = auVar84._12_4_;
    auVar25._28_4_ = uStack_964;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar254 * fVar142,
                            CONCAT48(fVar253 * fVar143,CONCAT44(fVar248 * fVar141,fVar238 * fVar115)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar117),auVar25);
    auVar26._4_4_ = fVar186 * fVar186;
    auVar26._0_4_ = fVar167 * fVar167;
    auVar26._8_4_ = fVar187 * fVar187;
    auVar26._12_4_ = fVar188 * fVar188;
    auVar26._16_4_ = fVar189 * fVar189;
    auVar26._20_4_ = fVar190 * fVar190;
    auVar26._24_4_ = fVar191 * fVar191;
    auVar26._28_4_ = uStack_964;
    auVar117 = vfmadd231ps_fma(auVar26,auVar161,auVar161);
    auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),auVar206,auVar206);
    auVar27._28_4_ = auVar13._28_4_;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(fVar142 * fVar142,
                            CONCAT48(fVar143 * fVar143,CONCAT44(fVar141 * fVar141,fVar115 * fVar115)
                                    )));
    auVar16 = vsubps_avx(ZEXT1632(auVar117),auVar27);
    auVar98 = vsqrtps_avx(auVar95);
    fVar115 = (auVar98._0_4_ + auVar219._0_4_) * 1.0000002;
    fVar141 = (auVar98._4_4_ + auVar219._4_4_) * 1.0000002;
    fVar143 = (auVar98._8_4_ + auVar219._8_4_) * 1.0000002;
    fVar142 = (auVar98._12_4_ + auVar219._12_4_) * 1.0000002;
    fVar144 = (auVar98._16_4_ + auVar219._16_4_) * 1.0000002;
    fVar146 = (auVar98._20_4_ + auVar219._20_4_) * 1.0000002;
    fVar148 = (auVar98._24_4_ + auVar219._24_4_) * 1.0000002;
    auVar28._4_4_ = fVar141 * fVar141;
    auVar28._0_4_ = fVar115 * fVar115;
    auVar28._8_4_ = fVar143 * fVar143;
    auVar28._12_4_ = fVar142 * fVar142;
    auVar28._16_4_ = fVar144 * fVar144;
    auVar28._20_4_ = fVar146 * fVar146;
    auVar28._24_4_ = fVar148 * fVar148;
    auVar28._28_4_ = auVar98._28_4_ + auVar219._28_4_;
    local_2c0._0_4_ = auVar15._0_4_ + auVar15._0_4_;
    local_2c0._4_4_ = auVar15._4_4_ + auVar15._4_4_;
    local_2c0._8_4_ = auVar15._8_4_ + auVar15._8_4_;
    local_2c0._12_4_ = auVar15._12_4_ + auVar15._12_4_;
    local_2c0._16_4_ = auVar15._16_4_ + auVar15._16_4_;
    local_2c0._20_4_ = auVar15._20_4_ + auVar15._20_4_;
    local_2c0._24_4_ = auVar15._24_4_ + auVar15._24_4_;
    local_2c0._28_4_ = auVar15._28_4_ + auVar15._28_4_;
    auVar219 = vsubps_avx(auVar16,auVar28);
    auVar261 = ZEXT1632(auVar84);
    auVar29._28_4_ = local_7e0._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar254 * fVar254,
                            CONCAT48(fVar253 * fVar253,CONCAT44(fVar248 * fVar248,fVar238 * fVar238)
                                    )));
    local_500 = vsubps_avx(local_2a0,auVar29);
    auVar30._4_4_ = local_2c0._4_4_ * local_2c0._4_4_;
    auVar30._0_4_ = local_2c0._0_4_ * local_2c0._0_4_;
    auVar30._8_4_ = local_2c0._8_4_ * local_2c0._8_4_;
    auVar30._12_4_ = local_2c0._12_4_ * local_2c0._12_4_;
    auVar30._16_4_ = local_2c0._16_4_ * local_2c0._16_4_;
    auVar30._20_4_ = local_2c0._20_4_ * local_2c0._20_4_;
    auVar30._24_4_ = local_2c0._24_4_ * local_2c0._24_4_;
    auVar30._28_4_ = 0x3f800002;
    fVar141 = local_500._0_4_;
    fVar143 = local_500._4_4_;
    fVar142 = local_500._8_4_;
    fVar144 = local_500._12_4_;
    fVar146 = local_500._16_4_;
    fVar148 = local_500._20_4_;
    fVar238 = local_500._24_4_;
    auVar31._4_4_ = auVar219._4_4_ * fVar143 * 4.0;
    auVar31._0_4_ = auVar219._0_4_ * fVar141 * 4.0;
    auVar31._8_4_ = auVar219._8_4_ * fVar142 * 4.0;
    auVar31._12_4_ = auVar219._12_4_ * fVar144 * 4.0;
    auVar31._16_4_ = auVar219._16_4_ * fVar146 * 4.0;
    auVar31._20_4_ = auVar219._20_4_ * fVar148 * 4.0;
    auVar31._24_4_ = auVar219._24_4_ * fVar238 * 4.0;
    auVar31._28_4_ = 0x40800000;
    auVar15 = vsubps_avx(auVar30,auVar31);
    auVar95 = vcmpps_avx(auVar15,auVar99,5);
    auVar99 = ZEXT1632(auVar149);
    fVar115 = local_500._28_4_;
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0x7f,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar95 >> 0xbf,0) == '\0') &&
        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f]) {
      auVar271._8_4_ = 0x7f800000;
      auVar271._0_8_ = 0x7f8000007f800000;
      auVar271._12_4_ = 0x7f800000;
      auVar271._16_4_ = 0x7f800000;
      auVar271._20_4_ = 0x7f800000;
      auVar271._24_4_ = 0x7f800000;
      auVar271._28_4_ = 0x7f800000;
      auVar202._8_4_ = 0xff800000;
      auVar202._0_8_ = 0xff800000ff800000;
      auVar202._12_4_ = 0xff800000;
      auVar202._16_4_ = 0xff800000;
      auVar202._20_4_ = 0xff800000;
      auVar202._24_4_ = 0xff800000;
      auVar202._28_4_ = 0xff800000;
    }
    else {
      auVar12 = vsqrtps_avx(auVar15);
      auVar100._0_4_ = fVar141 + fVar141;
      auVar100._4_4_ = fVar143 + fVar143;
      auVar100._8_4_ = fVar142 + fVar142;
      auVar100._12_4_ = fVar144 + fVar144;
      auVar100._16_4_ = fVar146 + fVar146;
      auVar100._20_4_ = fVar148 + fVar148;
      auVar100._24_4_ = fVar238 + fVar238;
      auVar100._28_4_ = fVar115 + fVar115;
      auVar11 = vrcpps_avx(auVar100);
      auVar4 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
      auVar203._8_4_ = 0x3f800000;
      auVar203._0_8_ = 0x3f8000003f800000;
      auVar203._12_4_ = 0x3f800000;
      auVar203._16_4_ = 0x3f800000;
      auVar203._20_4_ = 0x3f800000;
      auVar203._24_4_ = 0x3f800000;
      auVar203._28_4_ = 0x3f800000;
      auVar84 = vfnmadd213ps_fma(auVar100,auVar11,auVar203);
      auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar11,auVar11);
      auVar204._0_4_ = (uint)local_2c0._0_4_ ^ local_620;
      auVar204._4_4_ = (uint)local_2c0._4_4_ ^ uStack_61c;
      auVar204._8_4_ = (uint)local_2c0._8_4_ ^ uStack_618;
      auVar204._12_4_ = (uint)local_2c0._12_4_ ^ uStack_614;
      auVar204._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_610;
      auVar204._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_60c;
      auVar204._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_608;
      auVar204._28_4_ = (uint)local_2c0._28_4_ ^ uStack_604;
      auVar11 = vsubps_avx(auVar204,auVar12);
      auVar32._4_4_ = auVar11._4_4_ * auVar84._4_4_;
      auVar32._0_4_ = auVar11._0_4_ * auVar84._0_4_;
      auVar32._8_4_ = auVar11._8_4_ * auVar84._8_4_;
      auVar32._12_4_ = auVar11._12_4_ * auVar84._12_4_;
      auVar32._16_4_ = auVar11._16_4_ * 0.0;
      auVar32._20_4_ = auVar11._20_4_ * 0.0;
      auVar32._24_4_ = auVar11._24_4_ * 0.0;
      auVar32._28_4_ = auVar11._28_4_;
      auVar15 = vsubps_avx(auVar12,local_2c0);
      auVar101._0_4_ = auVar15._0_4_ * auVar84._0_4_;
      auVar101._4_4_ = auVar15._4_4_ * auVar84._4_4_;
      auVar101._8_4_ = auVar15._8_4_ * auVar84._8_4_;
      auVar101._12_4_ = auVar15._12_4_ * auVar84._12_4_;
      auVar101._16_4_ = auVar15._16_4_ * 0.0;
      auVar101._20_4_ = auVar15._20_4_ * 0.0;
      auVar101._24_4_ = auVar15._24_4_ * 0.0;
      auVar101._28_4_ = 0;
      auVar84 = vfmadd213ps_fma(auVar261,auVar32,auVar99);
      local_380 = ZEXT1632(CONCAT412(fVar145 * auVar84._12_4_,
                                     CONCAT48(fVar147 * auVar84._8_4_,
                                              CONCAT44(fVar140 * auVar84._4_4_,
                                                       fVar139 * auVar84._0_4_))));
      auVar56._4_4_ = uStack_81c;
      auVar56._0_4_ = local_820;
      auVar56._8_4_ = uStack_818;
      auVar56._12_4_ = uStack_814;
      auVar56._16_4_ = uStack_810;
      auVar56._20_4_ = uStack_80c;
      auVar56._24_4_ = uStack_808;
      auVar56._28_4_ = uStack_804;
      auVar15 = vandps_avx(auVar56,auVar29);
      auVar15 = vmaxps_avx(local_4e0,auVar15);
      auVar33._4_4_ = auVar15._4_4_ * 1.9073486e-06;
      auVar33._0_4_ = auVar15._0_4_ * 1.9073486e-06;
      auVar33._8_4_ = auVar15._8_4_ * 1.9073486e-06;
      auVar33._12_4_ = auVar15._12_4_ * 1.9073486e-06;
      auVar33._16_4_ = auVar15._16_4_ * 1.9073486e-06;
      auVar33._20_4_ = auVar15._20_4_ * 1.9073486e-06;
      auVar33._24_4_ = auVar15._24_4_ * 1.9073486e-06;
      auVar33._28_4_ = auVar15._28_4_;
      auVar15 = vandps_avx(local_500,auVar56);
      auVar15 = vcmpps_avx(auVar15,auVar33,1);
      auVar84 = vfmadd213ps_fma(auVar261,auVar101,auVar99);
      auVar233._8_4_ = 0x7f800000;
      auVar233._0_8_ = 0x7f8000007f800000;
      auVar233._12_4_ = 0x7f800000;
      auVar233._16_4_ = 0x7f800000;
      auVar233._20_4_ = 0x7f800000;
      auVar233._24_4_ = 0x7f800000;
      auVar233._28_4_ = 0x7f800000;
      auVar271 = vblendvps_avx(auVar233,auVar32,auVar4);
      local_3a0 = fVar139 * auVar84._0_4_;
      fStack_39c = fVar140 * auVar84._4_4_;
      fStack_398 = fVar147 * auVar84._8_4_;
      fStack_394 = fVar145 * auVar84._12_4_;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = auVar11._28_4_;
      auVar205._8_4_ = 0xff800000;
      auVar205._0_8_ = 0xff800000ff800000;
      auVar205._12_4_ = 0xff800000;
      auVar205._16_4_ = 0xff800000;
      auVar205._20_4_ = 0xff800000;
      auVar205._24_4_ = 0xff800000;
      auVar205._28_4_ = 0xff800000;
      auVar202 = vblendvps_avx(auVar205,auVar101,auVar4);
      auVar11 = auVar4 & auVar15;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar95 = vandps_avx(auVar15,auVar4);
        auVar15 = vcmpps_avx(auVar219,ZEXT832(0) << 0x20,2);
        auVar275._8_4_ = 0xff800000;
        auVar275._0_8_ = 0xff800000ff800000;
        auVar275._12_4_ = 0xff800000;
        auVar275._16_4_ = 0xff800000;
        auVar275._20_4_ = 0xff800000;
        auVar275._24_4_ = 0xff800000;
        auVar275._28_4_ = 0xff800000;
        auVar237._8_4_ = 0x7f800000;
        auVar237._0_8_ = 0x7f8000007f800000;
        auVar237._12_4_ = 0x7f800000;
        auVar237._16_4_ = 0x7f800000;
        auVar237._20_4_ = 0x7f800000;
        auVar237._24_4_ = 0x7f800000;
        auVar237._28_4_ = 0x7f800000;
        auVar219 = vblendvps_avx(auVar237,auVar275,auVar15);
        auVar84 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
        auVar11 = vpmovsxwd_avx2(auVar84);
        auVar271 = vblendvps_avx(auVar271,auVar219,auVar11);
        auVar219 = vblendvps_avx(auVar275,auVar237,auVar15);
        auVar202 = vblendvps_avx(auVar202,auVar219,auVar11);
        auVar110._0_8_ = auVar95._0_8_ ^ 0xffffffffffffffff;
        auVar110._8_4_ = auVar95._8_4_ ^ 0xffffffff;
        auVar110._12_4_ = auVar95._12_4_ ^ 0xffffffff;
        auVar110._16_4_ = auVar95._16_4_ ^ 0xffffffff;
        auVar110._20_4_ = auVar95._20_4_ ^ 0xffffffff;
        auVar110._24_4_ = auVar95._24_4_ ^ 0xffffffff;
        auVar110._28_4_ = auVar95._28_4_ ^ 0xffffffff;
        auVar95 = vorps_avx(auVar15,auVar110);
        auVar95 = vandps_avx(auVar4,auVar95);
      }
    }
    auVar219 = local_4a0 & auVar95;
    if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar219 >> 0x7f,0) != '\0') ||
          (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar219 >> 0xbf,0) != '\0') ||
        (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar219[0x1f] < '\0') {
      fVar248 = *(float *)(ray + k * 4 + 0x80);
      local_530 = ZEXT416((uint)fVar248);
      fVar253 = fVar248 - (float)local_8b0._0_4_;
      auVar102._4_4_ = fVar253;
      auVar102._0_4_ = fVar253;
      auVar102._8_4_ = fVar253;
      auVar102._12_4_ = fVar253;
      auVar102._16_4_ = fVar253;
      auVar102._20_4_ = fVar253;
      auVar102._24_4_ = fVar253;
      auVar102._28_4_ = fVar253;
      auVar15 = vminps_avx(auVar102,auVar202);
      auVar34._4_4_ = fVar186 * auVar270._4_4_;
      auVar34._0_4_ = fVar167 * auVar270._0_4_;
      auVar34._8_4_ = fVar187 * auVar270._8_4_;
      auVar34._12_4_ = fVar188 * auVar270._12_4_;
      auVar34._16_4_ = fVar189 * auVar270._16_4_;
      auVar34._20_4_ = fVar190 * auVar270._20_4_;
      auVar34._24_4_ = fVar191 * auVar270._24_4_;
      auVar34._28_4_ = auVar252._28_4_;
      auVar84 = vfmadd213ps_fma(auVar161,auVar246,auVar34);
      auVar63._4_4_ = fStack_35c;
      auVar63._0_4_ = local_360;
      auVar63._8_4_ = fStack_358;
      auVar63._12_4_ = fStack_354;
      auVar63._16_4_ = fStack_350;
      auVar63._20_4_ = fStack_34c;
      auVar63._24_4_ = fStack_348;
      auVar63._28_4_ = fStack_344;
      auVar161 = vmaxps_avx(auVar63,auVar271);
      auVar149 = vfmadd213ps_fma(auVar206,local_720,ZEXT1632(auVar84));
      auVar35._4_4_ = auVar270._4_4_ * (float)local_980._4_4_;
      auVar35._0_4_ = auVar270._0_4_ * (float)local_980._0_4_;
      auVar35._8_4_ = auVar270._8_4_ * fStack_978;
      auVar35._12_4_ = auVar270._12_4_ * fStack_974;
      auVar35._16_4_ = auVar270._16_4_ * fStack_970;
      auVar35._20_4_ = auVar270._20_4_ * fStack_96c;
      auVar35._24_4_ = auVar270._24_4_ * fStack_968;
      auVar35._28_4_ = 0;
      auVar84 = vfmadd231ps_fma(auVar35,_local_9c0,auVar246);
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar84),_local_7e0,local_720);
      auVar57._4_4_ = uStack_81c;
      auVar57._0_4_ = local_820;
      auVar57._8_4_ = uStack_818;
      auVar57._12_4_ = uStack_814;
      auVar57._16_4_ = uStack_810;
      auVar57._20_4_ = uStack_80c;
      auVar57._24_4_ = uStack_808;
      auVar57._28_4_ = uStack_804;
      auVar219 = vandps_avx(auVar57,ZEXT1632(auVar117));
      auVar234._8_4_ = 0x219392ef;
      auVar234._0_8_ = 0x219392ef219392ef;
      auVar234._12_4_ = 0x219392ef;
      auVar234._16_4_ = 0x219392ef;
      auVar234._20_4_ = 0x219392ef;
      auVar234._24_4_ = 0x219392ef;
      auVar234._28_4_ = 0x219392ef;
      auVar252 = vcmpps_avx(auVar219,auVar234,1);
      auVar219 = vrcpps_avx(ZEXT1632(auVar117));
      auVar235._8_4_ = 0x3f800000;
      auVar235._0_8_ = 0x3f8000003f800000;
      auVar235._12_4_ = 0x3f800000;
      auVar235._16_4_ = 0x3f800000;
      auVar235._20_4_ = 0x3f800000;
      auVar235._24_4_ = 0x3f800000;
      auVar235._28_4_ = 0x3f800000;
      auVar206 = ZEXT1632(auVar117);
      auVar84 = vfnmadd213ps_fma(auVar219,auVar206,auVar235);
      auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar219,auVar219);
      auVar267._0_4_ = auVar117._0_4_ ^ local_620;
      auVar267._4_4_ = auVar117._4_4_ ^ uStack_61c;
      auVar267._8_4_ = auVar117._8_4_ ^ uStack_618;
      auVar267._12_4_ = auVar117._12_4_ ^ uStack_614;
      auVar267._16_4_ = fStack_610;
      auVar267._20_4_ = fStack_60c;
      auVar267._24_4_ = fStack_608;
      auVar267._28_4_ = uStack_604;
      auVar36._4_4_ = auVar84._4_4_ * (float)(auVar149._4_4_ ^ uStack_61c);
      auVar36._0_4_ = auVar84._0_4_ * (float)(auVar149._0_4_ ^ local_620);
      auVar36._8_4_ = auVar84._8_4_ * (float)(auVar149._8_4_ ^ uStack_618);
      auVar36._12_4_ = auVar84._12_4_ * (float)(auVar149._12_4_ ^ uStack_614);
      auVar36._16_4_ = fStack_610 * 0.0;
      auVar36._20_4_ = fStack_60c * 0.0;
      auVar36._24_4_ = fStack_608 * 0.0;
      auVar36._28_4_ = uStack_604;
      auVar219 = vcmpps_avx(auVar206,auVar267,1);
      auVar219 = vorps_avx(auVar252,auVar219);
      auVar251._8_4_ = 0xff800000;
      auVar251._0_8_ = 0xff800000ff800000;
      auVar251._12_4_ = 0xff800000;
      auVar251._16_4_ = 0xff800000;
      auVar251._20_4_ = 0xff800000;
      auVar251._24_4_ = 0xff800000;
      auVar251._28_4_ = 0xff800000;
      auVar219 = vblendvps_avx(auVar36,auVar251,auVar219);
      auVar161 = vmaxps_avx(auVar161,auVar219);
      auVar219 = vcmpps_avx(auVar206,auVar267,6);
      auVar219 = vorps_avx(auVar252,auVar219);
      auVar207._8_4_ = 0x7f800000;
      auVar207._0_8_ = 0x7f8000007f800000;
      auVar207._12_4_ = 0x7f800000;
      auVar207._16_4_ = 0x7f800000;
      auVar207._20_4_ = 0x7f800000;
      auVar207._24_4_ = 0x7f800000;
      auVar207._28_4_ = 0x7f800000;
      auVar219 = vblendvps_avx(auVar36,auVar207,auVar219);
      auVar206 = vminps_avx(auVar15,auVar219);
      fVar167 = (float)(local_620 ^ (uint)local_960._0_4_);
      fVar186 = (float)(uStack_61c ^ (uint)local_960._4_4_);
      fVar187 = (float)(uStack_618 ^ (uint)local_960._8_4_);
      fVar188 = (float)(uStack_614 ^ (uint)local_960._12_4_);
      fVar189 = (float)((uint)fStack_610 ^ (uint)local_960._16_4_);
      fVar190 = (float)((uint)fStack_60c ^ (uint)local_960._20_4_);
      fVar191 = (float)((uint)fStack_608 ^ (uint)local_960._24_4_);
      auVar208._0_4_ = local_620 ^ (uint)local_740._0_4_;
      auVar208._4_4_ = uStack_61c ^ (uint)local_740._4_4_;
      auVar208._8_4_ = uStack_618 ^ (uint)local_740._8_4_;
      auVar208._12_4_ = uStack_614 ^ (uint)local_740._12_4_;
      auVar208._16_4_ = (uint)fStack_610 ^ (uint)local_740._16_4_;
      auVar208._20_4_ = (uint)fStack_60c ^ (uint)local_740._20_4_;
      auVar208._24_4_ = (uint)fStack_608 ^ (uint)local_740._24_4_;
      auVar208._28_4_ = uStack_604 ^ local_740._28_4_;
      auVar252 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar219 = vsubps_avx(auVar252,_local_900);
      auVar252 = vsubps_avx(auVar252,auVar17);
      auVar37._4_4_ = auVar252._4_4_ * fVar186;
      auVar37._0_4_ = auVar252._0_4_ * fVar167;
      auVar37._8_4_ = auVar252._8_4_ * fVar187;
      auVar37._12_4_ = auVar252._12_4_ * fVar188;
      auVar37._16_4_ = auVar252._16_4_ * fVar189;
      auVar37._20_4_ = auVar252._20_4_ * fVar190;
      auVar37._24_4_ = auVar252._24_4_ * fVar191;
      auVar37._28_4_ = auVar252._28_4_;
      auVar84 = vfmadd231ps_fma(auVar37,auVar208,auVar219);
      uStack_b04 = auVar18._28_4_;
      auVar221._0_4_ = local_620 ^ (uint)auVar18._0_4_;
      auVar221._4_4_ = uStack_61c ^ (uint)auVar18._4_4_;
      auVar221._8_4_ = uStack_618 ^ (uint)auVar18._8_4_;
      auVar221._12_4_ = uStack_614 ^ (uint)auVar18._12_4_;
      auVar221._16_4_ = (uint)fStack_610 ^ (uint)auVar18._16_4_;
      auVar221._20_4_ = (uint)fStack_60c ^ (uint)auVar18._20_4_;
      auVar221._24_4_ = (uint)fStack_608 ^ (uint)auVar18._24_4_;
      auVar221._28_4_ = uStack_604 ^ uStack_b04;
      auVar219 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar179);
      auVar149 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar221,auVar219);
      auVar38._4_4_ = fVar186 * (float)local_980._4_4_;
      auVar38._0_4_ = fVar167 * (float)local_980._0_4_;
      auVar38._8_4_ = fVar187 * fStack_978;
      auVar38._12_4_ = fVar188 * fStack_974;
      auVar38._16_4_ = fVar189 * fStack_970;
      auVar38._20_4_ = fVar190 * fStack_96c;
      auVar38._24_4_ = fVar191 * fStack_968;
      auVar38._28_4_ = uStack_604 ^ local_960._28_4_;
      auVar84 = vfmadd231ps_fma(auVar38,_local_9c0,auVar208);
      auVar117 = vfmadd231ps_fma(ZEXT1632(auVar84),_local_7e0,auVar221);
      auVar219 = vandps_avx(auVar57,ZEXT1632(auVar117));
      auVar15 = vrcpps_avx(ZEXT1632(auVar117));
      auVar236._8_4_ = 0x219392ef;
      auVar236._0_8_ = 0x219392ef219392ef;
      auVar236._12_4_ = 0x219392ef;
      auVar236._16_4_ = 0x219392ef;
      auVar236._20_4_ = 0x219392ef;
      auVar236._24_4_ = 0x219392ef;
      auVar236._28_4_ = 0x219392ef;
      auVar252 = vcmpps_avx(auVar219,auVar236,1);
      auVar179 = ZEXT1632(auVar117);
      auVar84 = vfnmadd213ps_fma(auVar15,auVar179,auVar235);
      auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar15,auVar15);
      auVar222._0_4_ = auVar117._0_4_ ^ local_620;
      auVar222._4_4_ = auVar117._4_4_ ^ uStack_61c;
      auVar222._8_4_ = auVar117._8_4_ ^ uStack_618;
      auVar222._12_4_ = auVar117._12_4_ ^ uStack_614;
      auVar222._16_4_ = fStack_610;
      auVar222._20_4_ = fStack_60c;
      auVar222._24_4_ = fStack_608;
      auVar222._28_4_ = uStack_604;
      auVar39._4_4_ = auVar84._4_4_ * (float)(auVar149._4_4_ ^ uStack_61c);
      auVar39._0_4_ = auVar84._0_4_ * (float)(auVar149._0_4_ ^ local_620);
      auVar39._8_4_ = auVar84._8_4_ * (float)(auVar149._8_4_ ^ uStack_618);
      auVar39._12_4_ = auVar84._12_4_ * (float)(auVar149._12_4_ ^ uStack_614);
      auVar39._16_4_ = fStack_610 * 0.0;
      auVar39._20_4_ = fStack_60c * 0.0;
      auVar39._24_4_ = fStack_608 * 0.0;
      auVar39._28_4_ = uStack_604;
      auVar219 = vcmpps_avx(auVar179,auVar222,1);
      auVar219 = vorps_avx(auVar219,auVar252);
      auVar103._8_4_ = 0xff800000;
      auVar103._0_8_ = 0xff800000ff800000;
      auVar103._12_4_ = 0xff800000;
      auVar103._16_4_ = 0xff800000;
      auVar103._20_4_ = 0xff800000;
      auVar103._24_4_ = 0xff800000;
      auVar103._28_4_ = 0xff800000;
      auVar219 = vblendvps_avx(auVar39,auVar103,auVar219);
      _local_800 = vmaxps_avx(auVar161,auVar219);
      auVar219 = vcmpps_avx(auVar179,auVar222,6);
      auVar219 = vorps_avx(auVar252,auVar219);
      auVar180._8_4_ = 0x7f800000;
      auVar180._0_8_ = 0x7f8000007f800000;
      auVar180._12_4_ = 0x7f800000;
      auVar180._16_4_ = 0x7f800000;
      auVar180._20_4_ = 0x7f800000;
      auVar180._24_4_ = 0x7f800000;
      auVar180._28_4_ = 0x7f800000;
      auVar219 = vblendvps_avx(auVar39,auVar180,auVar219);
      auVar95 = vandps_avx(auVar95,local_4a0);
      local_3c0 = vminps_avx(auVar206,auVar219);
      auVar219 = vcmpps_avx(_local_800,local_3c0,2);
      auVar252 = auVar95 & auVar219;
      if ((((((((auVar252 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar252 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar252 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar252 >> 0x7f,0) != '\0') ||
            (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar252 >> 0xbf,0) != '\0') ||
          (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar252[0x1f] < '\0') {
        auVar252 = vminps_avx(local_380,auVar235);
        auVar252 = vmaxps_avx(auVar252,ZEXT832(0) << 0x20);
        auVar62._4_4_ = fStack_39c;
        auVar62._0_4_ = local_3a0;
        auVar62._8_4_ = fStack_398;
        auVar62._12_4_ = fStack_394;
        auVar62._16_4_ = uStack_390;
        auVar62._20_4_ = uStack_38c;
        auVar62._24_4_ = uStack_388;
        auVar62._28_4_ = uStack_384;
        auVar161 = vminps_avx(auVar62,auVar235);
        auVar161 = vmaxps_avx(auVar161,ZEXT832(0) << 0x20);
        auVar40._4_4_ = (auVar252._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar252._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar252._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar252._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar252._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar252._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar252._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar252._28_4_ + 7.0;
        auVar84 = vfmadd213ps_fma(auVar40,local_760,local_9a0);
        auVar41._4_4_ = (auVar161._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar161._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar161._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar161._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar161._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar161._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar161._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar161._28_4_ + 7.0;
        auVar149 = vfmadd213ps_fma(auVar41,local_760,local_9a0);
        auVar252 = vminps_avx(local_780,local_7a0);
        auVar161 = vminps_avx(auVar19,auVar20);
        auVar252 = vminps_avx(auVar252,auVar161);
        auVar98 = vsubps_avx(auVar252,auVar98);
        auVar95 = vandps_avx(auVar219,auVar95);
        local_1a0 = ZEXT1632(auVar84);
        local_1c0 = ZEXT1632(auVar149);
        auVar42._4_4_ = auVar98._4_4_ * 0.99999976;
        auVar42._0_4_ = auVar98._0_4_ * 0.99999976;
        auVar42._8_4_ = auVar98._8_4_ * 0.99999976;
        auVar42._12_4_ = auVar98._12_4_ * 0.99999976;
        auVar42._16_4_ = auVar98._16_4_ * 0.99999976;
        auVar42._20_4_ = auVar98._20_4_ * 0.99999976;
        auVar42._24_4_ = auVar98._24_4_ * 0.99999976;
        auVar42._28_4_ = 0x3f7ffffc;
        auVar219 = vmaxps_avx(ZEXT832(0) << 0x20,auVar42);
        auVar43._4_4_ = auVar219._4_4_ * auVar219._4_4_;
        auVar43._0_4_ = auVar219._0_4_ * auVar219._0_4_;
        auVar43._8_4_ = auVar219._8_4_ * auVar219._8_4_;
        auVar43._12_4_ = auVar219._12_4_ * auVar219._12_4_;
        auVar43._16_4_ = auVar219._16_4_ * auVar219._16_4_;
        auVar43._20_4_ = auVar219._20_4_ * auVar219._20_4_;
        auVar43._24_4_ = auVar219._24_4_ * auVar219._24_4_;
        auVar43._28_4_ = auVar219._28_4_;
        auVar98 = vsubps_avx(auVar16,auVar43);
        auVar44._4_4_ = auVar98._4_4_ * fVar143 * 4.0;
        auVar44._0_4_ = auVar98._0_4_ * fVar141 * 4.0;
        auVar44._8_4_ = auVar98._8_4_ * fVar142 * 4.0;
        auVar44._12_4_ = auVar98._12_4_ * fVar144 * 4.0;
        auVar44._16_4_ = auVar98._16_4_ * fVar146 * 4.0;
        auVar44._20_4_ = auVar98._20_4_ * fVar148 * 4.0;
        auVar44._24_4_ = auVar98._24_4_ * fVar238 * 4.0;
        auVar44._28_4_ = auVar219._28_4_;
        auVar252 = vsubps_avx(auVar30,auVar44);
        auVar54 = ZEXT412(0);
        auVar161 = ZEXT1232(auVar54) << 0x20;
        local_860 = ZEXT1232(auVar54) << 0x20;
        auVar219 = vcmpps_avx(auVar252,ZEXT832(0) << 0x20,5);
        if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar219 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar219 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar219 >> 0x7f,0) == '\0') &&
              (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar219 >> 0xbf,0) == '\0') &&
            (auVar219 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar219[0x1f]) {
          _local_880 = ZEXT1232(auVar54) << 0x20;
          auVar181 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar200 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar223._8_4_ = 0x7f800000;
          auVar223._0_8_ = 0x7f8000007f800000;
          auVar223._12_4_ = 0x7f800000;
          auVar223._16_4_ = 0x7f800000;
          auVar223._20_4_ = 0x7f800000;
          auVar223._24_4_ = 0x7f800000;
          auVar223._28_4_ = 0x7f800000;
          auVar229._8_4_ = 0xff800000;
          auVar229._0_8_ = 0xff800000ff800000;
          auVar229._12_4_ = 0xff800000;
          auVar229._16_4_ = 0xff800000;
          auVar229._20_4_ = 0xff800000;
          auVar229._24_4_ = 0xff800000;
          auVar229._28_4_ = 0xff800000;
          _local_840 = local_860;
        }
        else {
          auVar206 = vsqrtps_avx(auVar252);
          auVar182._0_4_ = fVar141 + fVar141;
          auVar182._4_4_ = fVar143 + fVar143;
          auVar182._8_4_ = fVar142 + fVar142;
          auVar182._12_4_ = fVar144 + fVar144;
          auVar182._16_4_ = fVar146 + fVar146;
          auVar182._20_4_ = fVar148 + fVar148;
          auVar182._24_4_ = fVar238 + fVar238;
          auVar182._28_4_ = fVar115 + fVar115;
          auVar161 = vrcpps_avx(auVar182);
          auVar84 = vfnmadd213ps_fma(auVar182,auVar161,auVar235);
          auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar161,auVar161);
          auVar209._0_4_ = (uint)local_2c0._0_4_ ^ local_620;
          auVar209._4_4_ = (uint)local_2c0._4_4_ ^ uStack_61c;
          auVar209._8_4_ = (uint)local_2c0._8_4_ ^ uStack_618;
          auVar209._12_4_ = (uint)local_2c0._12_4_ ^ uStack_614;
          auVar209._16_4_ = (uint)local_2c0._16_4_ ^ (uint)fStack_610;
          auVar209._20_4_ = (uint)local_2c0._20_4_ ^ (uint)fStack_60c;
          auVar209._24_4_ = (uint)local_2c0._24_4_ ^ (uint)fStack_608;
          auVar209._28_4_ = (uint)local_2c0._28_4_ ^ uStack_604;
          auVar161 = vsubps_avx(auVar209,auVar206);
          auVar206 = vsubps_avx(auVar206,local_2c0);
          fVar167 = auVar161._0_4_ * auVar84._0_4_;
          fVar186 = auVar161._4_4_ * auVar84._4_4_;
          auVar45._4_4_ = fVar186;
          auVar45._0_4_ = fVar167;
          fVar187 = auVar161._8_4_ * auVar84._8_4_;
          auVar45._8_4_ = fVar187;
          fVar188 = auVar161._12_4_ * auVar84._12_4_;
          auVar45._12_4_ = fVar188;
          fVar189 = auVar161._16_4_ * 0.0;
          auVar45._16_4_ = fVar189;
          fVar190 = auVar161._20_4_ * 0.0;
          auVar45._20_4_ = fVar190;
          fVar191 = auVar161._24_4_ * 0.0;
          auVar45._24_4_ = fVar191;
          auVar45._28_4_ = local_9c0._28_4_;
          fVar115 = auVar206._0_4_ * auVar84._0_4_;
          fVar141 = auVar206._4_4_ * auVar84._4_4_;
          auVar46._4_4_ = fVar141;
          auVar46._0_4_ = fVar115;
          fVar143 = auVar206._8_4_ * auVar84._8_4_;
          auVar46._8_4_ = fVar143;
          fVar142 = auVar206._12_4_ * auVar84._12_4_;
          auVar46._12_4_ = fVar142;
          fVar144 = auVar206._16_4_ * 0.0;
          auVar46._16_4_ = fVar144;
          fVar146 = auVar206._20_4_ * 0.0;
          auVar46._20_4_ = fVar146;
          fVar148 = auVar206._24_4_ * 0.0;
          auVar46._24_4_ = fVar148;
          auVar46._28_4_ = 0x3f800000;
          auVar84 = vfmadd213ps_fma(auVar261,auVar45,auVar99);
          auVar149 = vfmadd213ps_fma(auVar261,auVar46,auVar99);
          auVar47._28_4_ = auVar161._28_4_;
          auVar47._0_28_ =
               ZEXT1628(CONCAT412(fVar145 * auVar84._12_4_,
                                  CONCAT48(fVar147 * auVar84._8_4_,
                                           CONCAT44(fVar140 * auVar84._4_4_,fVar139 * auVar84._0_4_)
                                          )));
          auVar161 = ZEXT1632(CONCAT412(fVar145 * auVar149._12_4_,
                                        CONCAT48(fVar147 * auVar149._8_4_,
                                                 CONCAT44(fVar140 * auVar149._4_4_,
                                                          fVar139 * auVar149._0_4_))));
          auVar84 = vfmadd213ps_fma(auVar13,auVar47,auVar178);
          auVar149 = vfmadd213ps_fma(auVar13,auVar161,auVar178);
          auVar117 = vfmadd213ps_fma(auVar14,auVar47,auVar96);
          auVar83 = vfmadd213ps_fma(auVar14,auVar161,auVar96);
          auVar118 = vfmadd213ps_fma(auVar47,auVar181,auVar277);
          auVar91 = vfmadd213ps_fma(auVar181,auVar161,auVar277);
          auVar48._4_4_ = fVar186 * (float)local_7e0._4_4_;
          auVar48._0_4_ = fVar167 * (float)local_7e0._0_4_;
          auVar48._8_4_ = fVar187 * fStack_7d8;
          auVar48._12_4_ = fVar188 * fStack_7d4;
          auVar48._16_4_ = fVar189 * fStack_7d0;
          auVar48._20_4_ = fVar190 * fStack_7cc;
          auVar48._24_4_ = fVar191 * fStack_7c8;
          auVar48._28_4_ = 0;
          auVar161 = vsubps_avx(auVar48,ZEXT1632(auVar84));
          auVar183._0_4_ = (float)local_9c0._0_4_ * fVar167;
          auVar183._4_4_ = (float)local_9c0._4_4_ * fVar186;
          auVar183._8_4_ = fStack_9b8 * fVar187;
          auVar183._12_4_ = fStack_9b4 * fVar188;
          auVar183._16_4_ = fStack_9b0 * fVar189;
          auVar183._20_4_ = fStack_9ac * fVar190;
          auVar183._24_4_ = fStack_9a8 * fVar191;
          auVar183._28_4_ = 0;
          auVar181 = vsubps_avx(auVar183,ZEXT1632(auVar117));
          auVar224._0_4_ = (float)local_980._0_4_ * fVar167;
          auVar224._4_4_ = (float)local_980._4_4_ * fVar186;
          auVar224._8_4_ = fStack_978 * fVar187;
          auVar224._12_4_ = fStack_974 * fVar188;
          auVar224._16_4_ = fStack_970 * fVar189;
          auVar224._20_4_ = fStack_96c * fVar190;
          auVar224._24_4_ = fStack_968 * fVar191;
          auVar224._28_4_ = 0;
          auVar13 = vsubps_avx(auVar224,ZEXT1632(auVar118));
          auVar200 = auVar13._0_28_;
          auVar49._4_4_ = fVar141 * (float)local_7e0._4_4_;
          auVar49._0_4_ = fVar115 * (float)local_7e0._0_4_;
          auVar49._8_4_ = fVar143 * fStack_7d8;
          auVar49._12_4_ = fVar142 * fStack_7d4;
          auVar49._16_4_ = fVar144 * fStack_7d0;
          auVar49._20_4_ = fVar146 * fStack_7cc;
          auVar49._24_4_ = fVar148 * fStack_7c8;
          auVar49._28_4_ = 0;
          _local_840 = vsubps_avx(auVar49,ZEXT1632(auVar149));
          auVar50._4_4_ = (float)local_9c0._4_4_ * fVar141;
          auVar50._0_4_ = (float)local_9c0._0_4_ * fVar115;
          auVar50._8_4_ = fStack_9b8 * fVar143;
          auVar50._12_4_ = fStack_9b4 * fVar142;
          auVar50._16_4_ = fStack_9b0 * fVar144;
          auVar50._20_4_ = fStack_9ac * fVar146;
          auVar50._24_4_ = fStack_9a8 * fVar148;
          auVar50._28_4_ = local_840._28_4_;
          local_860 = vsubps_avx(auVar50,ZEXT1632(auVar83));
          auVar51._4_4_ = (float)local_980._4_4_ * fVar141;
          auVar51._0_4_ = (float)local_980._0_4_ * fVar115;
          auVar51._8_4_ = fStack_978 * fVar143;
          auVar51._12_4_ = fStack_974 * fVar142;
          auVar51._16_4_ = fStack_970 * fVar144;
          auVar51._20_4_ = fStack_96c * fVar146;
          auVar51._24_4_ = fStack_968 * fVar148;
          auVar51._28_4_ = local_860._28_4_;
          _local_880 = vsubps_avx(auVar51,ZEXT1632(auVar91));
          auVar262 = ZEXT864(0) << 0x20;
          auVar13 = vcmpps_avx(auVar252,_DAT_01faff00,5);
          auVar225._8_4_ = 0x7f800000;
          auVar225._0_8_ = 0x7f8000007f800000;
          auVar225._12_4_ = 0x7f800000;
          auVar225._16_4_ = 0x7f800000;
          auVar225._20_4_ = 0x7f800000;
          auVar225._24_4_ = 0x7f800000;
          auVar225._28_4_ = 0x7f800000;
          auVar223 = vblendvps_avx(auVar225,auVar45,auVar13);
          auVar58._4_4_ = uStack_81c;
          auVar58._0_4_ = local_820;
          auVar58._8_4_ = uStack_818;
          auVar58._12_4_ = uStack_814;
          auVar58._16_4_ = uStack_810;
          auVar58._20_4_ = uStack_80c;
          auVar58._24_4_ = uStack_808;
          auVar58._28_4_ = uStack_804;
          auVar252 = vandps_avx(auVar58,auVar29);
          auVar252 = vmaxps_avx(local_4e0,auVar252);
          auVar52._4_4_ = auVar252._4_4_ * 1.9073486e-06;
          auVar52._0_4_ = auVar252._0_4_ * 1.9073486e-06;
          auVar52._8_4_ = auVar252._8_4_ * 1.9073486e-06;
          auVar52._12_4_ = auVar252._12_4_ * 1.9073486e-06;
          auVar52._16_4_ = auVar252._16_4_ * 1.9073486e-06;
          auVar52._20_4_ = auVar252._20_4_ * 1.9073486e-06;
          auVar52._24_4_ = auVar252._24_4_ * 1.9073486e-06;
          auVar52._28_4_ = auVar252._28_4_;
          auVar252 = vandps_avx(auVar58,local_500);
          auVar252 = vcmpps_avx(auVar252,auVar52,1);
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          auVar229 = vblendvps_avx(auVar230,auVar46,auVar13);
          auVar14 = auVar13 & auVar252;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar219 = vandps_avx(auVar252,auVar13);
            auVar14 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,2);
            auVar268._8_4_ = 0xff800000;
            auVar268._0_8_ = 0xff800000ff800000;
            auVar268._12_4_ = 0xff800000;
            auVar268._16_4_ = 0xff800000;
            auVar268._20_4_ = 0xff800000;
            auVar268._24_4_ = 0xff800000;
            auVar268._28_4_ = 0xff800000;
            auVar276._8_4_ = 0x7f800000;
            auVar276._0_8_ = 0x7f8000007f800000;
            auVar276._12_4_ = 0x7f800000;
            auVar276._16_4_ = 0x7f800000;
            auVar276._20_4_ = 0x7f800000;
            auVar276._24_4_ = 0x7f800000;
            auVar276._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar276,auVar268,auVar14);
            auVar84 = vpackssdw_avx(auVar219._0_16_,auVar219._16_16_);
            auVar252 = vpmovsxwd_avx2(auVar84);
            auVar223 = vblendvps_avx(auVar223,auVar98,auVar252);
            auVar98 = vblendvps_avx(auVar268,auVar276,auVar14);
            auVar262 = ZEXT3264(auVar98);
            auVar229 = vblendvps_avx(auVar229,auVar98,auVar252);
            auVar244._0_8_ = auVar219._0_8_ ^ 0xffffffffffffffff;
            auVar244._8_4_ = auVar219._8_4_ ^ 0xffffffff;
            auVar244._12_4_ = auVar219._12_4_ ^ 0xffffffff;
            auVar244._16_4_ = auVar219._16_4_ ^ 0xffffffff;
            auVar244._20_4_ = auVar219._20_4_ ^ 0xffffffff;
            auVar244._24_4_ = auVar219._24_4_ ^ 0xffffffff;
            auVar244._28_4_ = auVar219._28_4_ ^ 0xffffffff;
            auVar219 = vorps_avx(auVar14,auVar244);
            auVar219 = vandps_avx(auVar219,auVar13);
          }
          auVar247 = ZEXT3264(auVar252);
        }
        auVar279 = ZEXT3264(_local_980);
        local_420 = _local_800;
        local_400 = vminps_avx(local_3c0,auVar223);
        _local_640 = vmaxps_avx(_local_800,auVar229);
        local_3e0 = _local_640;
        auVar98 = vcmpps_avx(_local_800,local_400,2);
        local_580 = vandps_avx(auVar98,auVar95);
        auVar98 = vcmpps_avx(_local_640,local_3c0,2);
        local_5c0 = vandps_avx(auVar98,auVar95);
        auVar95 = vorps_avx(local_5c0,local_580);
        if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar95 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar95 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar95 >> 0x7f,0) != '\0') ||
              (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar95 >> 0xbf,0) != '\0') ||
            (auVar95 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar95[0x1f] < '\0') {
          local_5e0._0_8_ = auVar219._0_8_ ^ 0xffffffffffffffff;
          local_5e0._8_4_ = auVar219._8_4_ ^ 0xffffffff;
          local_5e0._12_4_ = auVar219._12_4_ ^ 0xffffffff;
          local_5e0._16_4_ = auVar219._16_4_ ^ 0xffffffff;
          local_5e0._20_4_ = auVar219._20_4_ ^ 0xffffffff;
          local_5e0._24_4_ = auVar219._24_4_ ^ 0xffffffff;
          local_5e0._28_4_ = auVar219._28_4_ ^ 0xffffffff;
          auVar53._4_4_ = (float)local_980._4_4_ * auVar200._4_4_;
          auVar53._0_4_ = (float)local_980._0_4_ * auVar200._0_4_;
          auVar53._8_4_ = fStack_978 * auVar200._8_4_;
          auVar53._12_4_ = fStack_974 * auVar200._12_4_;
          auVar53._16_4_ = fStack_970 * auVar200._16_4_;
          auVar53._20_4_ = fStack_96c * auVar200._20_4_;
          auVar53._24_4_ = fStack_968 * auVar200._24_4_;
          auVar53._28_4_ = auVar95._28_4_;
          auVar84 = vfmadd213ps_fma(auVar181,_local_9c0,auVar53);
          auVar84 = vfmadd213ps_fma(auVar161,_local_7e0,ZEXT1632(auVar84));
          auVar59._4_4_ = uStack_81c;
          auVar59._0_4_ = local_820;
          auVar59._8_4_ = uStack_818;
          auVar59._12_4_ = uStack_814;
          auVar59._16_4_ = uStack_810;
          auVar59._20_4_ = uStack_80c;
          auVar59._24_4_ = uStack_808;
          auVar59._28_4_ = uStack_804;
          auVar95 = vandps_avx(ZEXT1632(auVar84),auVar59);
          auVar135._8_4_ = 0x3e99999a;
          auVar135._0_8_ = 0x3e99999a3e99999a;
          auVar135._12_4_ = 0x3e99999a;
          auVar135._16_4_ = 0x3e99999a;
          auVar135._20_4_ = 0x3e99999a;
          auVar135._24_4_ = 0x3e99999a;
          auVar135._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar135,1);
          auVar95 = vorps_avx(auVar95,local_5e0);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar162,auVar136,auVar95);
          local_600._4_4_ = local_bc8;
          local_600._0_4_ = local_bc8;
          local_600._8_4_ = local_bc8;
          local_600._12_4_ = local_bc8;
          local_600._16_4_ = local_bc8;
          local_600._20_4_ = local_bc8;
          local_600._24_4_ = local_bc8;
          local_600._28_4_ = local_bc8;
          local_5a0 = vpcmpgtd_avx2(auVar95,local_600);
          local_560 = vpandn_avx2(local_5a0,local_580);
          auVar137 = ZEXT3264(local_560);
          auVar95 = local_580 & ~local_5a0;
          fStack_abc = auVar85._4_4_;
          fStack_ab8 = auVar85._8_4_;
          fStack_ab4 = auVar85._12_4_;
          if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar95 >> 0x7f,0) == '\0') &&
                (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar95 >> 0xbf,0) == '\0') &&
              (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar95[0x1f]) {
            auVar107._4_4_ = fVar248;
            auVar107._0_4_ = fVar248;
            auVar107._8_4_ = fVar248;
            auVar107._12_4_ = fVar248;
            auVar107._16_4_ = fVar248;
            auVar107._20_4_ = fVar248;
            auVar107._24_4_ = fVar248;
            auVar107._28_4_ = fVar248;
          }
          else {
            auVar149 = vminps_avx(auVar8,auVar10);
            auVar84 = vmaxps_avx(auVar8,auVar10);
            auVar117 = vminps_avx(auVar9,auVar85);
            auVar83 = vminps_avx(auVar149,auVar117);
            auVar149 = vmaxps_avx(auVar9,auVar85);
            auVar117 = vmaxps_avx(auVar84,auVar149);
            auVar84 = vandps_avx(auVar83,auVar231);
            auVar149 = vandps_avx(auVar117,auVar231);
            auVar84 = vmaxps_avx(auVar84,auVar149);
            auVar149 = vmovshdup_avx(auVar84);
            auVar149 = vmaxss_avx(auVar149,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar149);
            fVar115 = auVar84._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar117,auVar117,0xff);
            local_b60._4_4_ = (float)local_800._4_4_ + (float)local_920._4_4_;
            local_b60._0_4_ = (float)local_800._0_4_ + (float)local_920._0_4_;
            fStack_b58 = fStack_7f8 + fStack_918;
            fStack_b54 = fStack_7f4 + fStack_914;
            fStack_b50 = fStack_7f0 + fStack_910;
            fStack_b4c = fStack_7ec + fStack_90c;
            fStack_b48 = fStack_7e8 + fStack_908;
            fStack_b44 = fStack_7e4 + fStack_904;
            do {
              auVar108._8_4_ = 0x7f800000;
              auVar108._0_8_ = 0x7f8000007f800000;
              auVar108._12_4_ = 0x7f800000;
              auVar108._16_4_ = 0x7f800000;
              auVar108._20_4_ = 0x7f800000;
              auVar108._24_4_ = 0x7f800000;
              auVar108._28_4_ = 0x7f800000;
              auVar95 = auVar137._0_32_;
              auVar219 = vblendvps_avx(auVar108,_local_800,auVar95);
              auVar98 = vshufps_avx(auVar219,auVar219,0xb1);
              auVar98 = vminps_avx(auVar219,auVar98);
              auVar252 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar252);
              auVar252 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar252);
              auVar219 = vcmpps_avx(auVar219,auVar98,0);
              auVar98 = auVar95 & auVar219;
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar98 >> 0x7f,0) != '\0') ||
                    (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0xbf,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar98[0x1f] < '\0') {
                auVar95 = vandps_avx(auVar219,auVar95);
              }
              uVar71 = vmovmskps_avx(auVar95);
              iVar21 = 0;
              for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar72 = iVar21 << 2;
              *(undefined4 *)(local_560 + uVar72) = 0;
              uVar71 = *(uint *)(local_1a0 + uVar72);
              uVar72 = *(uint *)(local_420 + uVar72);
              fVar139 = auVar5._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                fVar139 = sqrtf((float)local_940._0_4_);
              }
              local_740._0_4_ = fVar139 * 1.9073486e-06;
              auVar84 = vinsertps_avx(ZEXT416(uVar72),ZEXT416(uVar71),0x10);
              bVar77 = true;
              uVar73 = 0;
              do {
                auVar117 = vmovshdup_avx(auVar84);
                fVar143 = 1.0 - auVar117._0_4_;
                auVar149 = vshufps_avx(auVar84,auVar84,0x55);
                fVar139 = auVar149._0_4_;
                auVar119._0_4_ = fVar113 * fVar139;
                fVar140 = auVar149._4_4_;
                auVar119._4_4_ = auVar10._4_4_ * fVar140;
                fVar141 = auVar149._8_4_;
                auVar119._8_4_ = auVar10._8_4_ * fVar141;
                fVar147 = auVar149._12_4_;
                auVar119._12_4_ = auVar10._12_4_ * fVar147;
                auVar150._4_4_ = fVar143;
                auVar150._0_4_ = fVar143;
                auVar150._8_4_ = fVar143;
                auVar150._12_4_ = fVar143;
                auVar149 = vfmadd231ps_fma(auVar119,auVar150,auVar8);
                auVar168._0_4_ = fVar114 * fVar139;
                auVar168._4_4_ = auVar9._4_4_ * fVar140;
                auVar168._8_4_ = auVar9._8_4_ * fVar141;
                auVar168._12_4_ = auVar9._12_4_ * fVar147;
                auVar83 = vfmadd231ps_fma(auVar168,auVar150,auVar10);
                auVar215._0_4_ = fVar139 * auVar83._0_4_;
                auVar215._4_4_ = fVar140 * auVar83._4_4_;
                auVar215._8_4_ = fVar141 * auVar83._8_4_;
                auVar215._12_4_ = fVar147 * auVar83._12_4_;
                auVar118 = vfmadd231ps_fma(auVar215,auVar150,auVar149);
                auVar120._0_4_ = fVar139 * fVar112;
                auVar120._4_4_ = fVar140 * fStack_abc;
                auVar120._8_4_ = fVar141 * fStack_ab8;
                auVar120._12_4_ = fVar147 * fStack_ab4;
                auVar149 = vfmadd231ps_fma(auVar120,auVar150,auVar9);
                auVar194._0_4_ = fVar139 * auVar149._0_4_;
                auVar194._4_4_ = fVar140 * auVar149._4_4_;
                auVar194._8_4_ = fVar141 * auVar149._8_4_;
                auVar194._12_4_ = fVar147 * auVar149._12_4_;
                auVar83 = vfmadd231ps_fma(auVar194,auVar150,auVar83);
                fVar145 = auVar84._0_4_;
                auVar121._4_4_ = fVar145;
                auVar121._0_4_ = fVar145;
                auVar121._8_4_ = fVar145;
                auVar121._12_4_ = fVar145;
                auVar149 = vfmadd213ps_fma(auVar121,local_930,_DAT_01f7aa10);
                auVar87._0_4_ = fVar139 * auVar83._0_4_;
                auVar87._4_4_ = fVar140 * auVar83._4_4_;
                auVar87._8_4_ = fVar141 * auVar83._8_4_;
                auVar87._12_4_ = fVar147 * auVar83._12_4_;
                auVar91 = vfmadd231ps_fma(auVar87,auVar118,auVar150);
                local_720._0_16_ = auVar91;
                auVar149 = vsubps_avx(auVar149,auVar91);
                _local_900 = auVar149;
                auVar149 = vdpps_avx(auVar149,auVar149,0x7f);
                fVar139 = auVar149._0_4_;
                if (fVar139 < 0.0) {
                  auVar279._0_4_ = sqrtf(fVar139);
                  auVar279._4_60_ = extraout_var;
                  auVar91 = auVar279._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar149,auVar149);
                }
                auVar83 = vsubps_avx(auVar83,auVar118);
                auVar227._0_4_ = auVar83._0_4_ * 3.0;
                auVar227._4_4_ = auVar83._4_4_ * 3.0;
                auVar227._8_4_ = auVar83._8_4_ * 3.0;
                auVar227._12_4_ = auVar83._12_4_ * 3.0;
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar143),
                                          auVar117);
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar117,
                                           ZEXT416((uint)fVar143));
                fVar143 = fVar143 * 6.0;
                fVar140 = auVar83._0_4_ * 6.0;
                fVar141 = auVar118._0_4_ * 6.0;
                fVar147 = auVar117._0_4_ * 6.0;
                auVar169._0_4_ = fVar147 * fVar112;
                auVar169._4_4_ = fVar147 * fStack_abc;
                auVar169._8_4_ = fVar147 * fStack_ab8;
                auVar169._12_4_ = fVar147 * fStack_ab4;
                auVar122._4_4_ = fVar141;
                auVar122._0_4_ = fVar141;
                auVar122._8_4_ = fVar141;
                auVar122._12_4_ = fVar141;
                auVar117 = vfmadd132ps_fma(auVar122,auVar169,auVar9);
                auVar170._4_4_ = fVar140;
                auVar170._0_4_ = fVar140;
                auVar170._8_4_ = fVar140;
                auVar170._12_4_ = fVar140;
                auVar117 = vfmadd132ps_fma(auVar170,auVar117,auVar10);
                auVar83 = vdpps_avx(auVar227,auVar227,0x7f);
                auVar123._4_4_ = fVar143;
                auVar123._0_4_ = fVar143;
                auVar123._8_4_ = fVar143;
                auVar123._12_4_ = fVar143;
                auVar193 = vfmadd132ps_fma(auVar123,auVar117,auVar8);
                auVar117 = vblendps_avx(auVar83,_DAT_01f7aa10,0xe);
                auVar118 = vrsqrtss_avx(auVar117,auVar117);
                fVar147 = auVar83._0_4_;
                fVar140 = auVar118._0_4_;
                auVar118 = vdpps_avx(auVar227,auVar193,0x7f);
                fVar140 = fVar140 * 1.5 + fVar147 * -0.5 * fVar140 * fVar140 * fVar140;
                auVar124._0_4_ = auVar193._0_4_ * fVar147;
                auVar124._4_4_ = auVar193._4_4_ * fVar147;
                auVar124._8_4_ = auVar193._8_4_ * fVar147;
                auVar124._12_4_ = auVar193._12_4_ * fVar147;
                fVar141 = auVar118._0_4_;
                auVar216._0_4_ = auVar227._0_4_ * fVar141;
                auVar216._4_4_ = auVar227._4_4_ * fVar141;
                auVar216._8_4_ = auVar227._8_4_ * fVar141;
                auVar216._12_4_ = auVar227._12_4_ * fVar141;
                auVar118 = vsubps_avx(auVar124,auVar216);
                auVar117 = vrcpss_avx(auVar117,auVar117);
                auVar193 = vfnmadd213ss_fma(auVar117,auVar83,ZEXT416(0x40000000));
                fVar141 = auVar117._0_4_ * auVar193._0_4_;
                auVar117 = vmaxss_avx(ZEXT416((uint)fVar115),
                                      ZEXT416((uint)(fVar145 * (float)local_740._0_4_)));
                uVar55 = CONCAT44(auVar227._4_4_,auVar227._0_4_);
                auVar241._0_8_ = uVar55 ^ 0x8000000080000000;
                auVar241._8_4_ = -auVar227._8_4_;
                auVar241._12_4_ = -auVar227._12_4_;
                auVar171._0_4_ = fVar140 * auVar118._0_4_ * fVar141;
                auVar171._4_4_ = fVar140 * auVar118._4_4_ * fVar141;
                auVar171._8_4_ = fVar140 * auVar118._8_4_ * fVar141;
                auVar171._12_4_ = fVar140 * auVar118._12_4_ * fVar141;
                local_960._0_4_ = auVar227._0_4_ * fVar140;
                local_960._4_4_ = auVar227._4_4_ * fVar140;
                local_960._8_4_ = auVar227._8_4_ * fVar140;
                local_960._12_4_ = auVar227._12_4_ * fVar140;
                uVar71 = auVar117._0_4_;
                if (fVar147 < -fVar147) {
                  local_9a0._0_16_ = auVar171;
                  fVar140 = sqrtf(fVar147);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar117 = ZEXT416(uVar71);
                  auVar171 = local_9a0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar140 = auVar83._0_4_;
                }
                auVar83 = vdpps_avx(_local_900,local_960._0_16_,0x7f);
                auVar116 = vfmadd213ss_fma(ZEXT416((uint)fVar115),auVar91,auVar117);
                auVar118 = vdpps_avx(auVar241,local_960._0_16_,0x7f);
                auVar193 = vdpps_avx(_local_900,auVar171,0x7f);
                auVar82 = vdpps_avx(local_930,local_960._0_16_,0x7f);
                auVar210 = vfmadd213ss_fma(ZEXT416((uint)(auVar91._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar115 / fVar140)),auVar116);
                auVar88._0_4_ = auVar83._0_4_ * auVar83._0_4_;
                auVar88._4_4_ = auVar83._4_4_ * auVar83._4_4_;
                auVar88._8_4_ = auVar83._8_4_ * auVar83._8_4_;
                auVar88._12_4_ = auVar83._12_4_ * auVar83._12_4_;
                auVar91 = vdpps_avx(_local_900,auVar241,0x7f);
                auVar192 = vsubps_avx(auVar149,auVar88);
                auVar116 = vrsqrtss_avx(auVar192,auVar192);
                fVar141 = auVar192._0_4_;
                fVar140 = auVar116._0_4_;
                fVar140 = fVar140 * 1.5 + fVar141 * -0.5 * fVar140 * fVar140 * fVar140;
                auVar116 = vdpps_avx(_local_900,local_930,0x7f);
                auVar193 = ZEXT416((uint)(auVar118._0_4_ + auVar193._0_4_));
                local_960._0_16_ = vfnmadd231ss_fma(auVar91,auVar83,auVar193);
                auVar118 = vfnmadd231ss_fma(auVar116,auVar83,auVar82);
                if (fVar141 < 0.0) {
                  local_9a0._0_16_ = auVar83;
                  local_760._0_16_ = auVar82;
                  local_780._0_4_ = fVar140;
                  local_7a0._0_16_ = auVar118;
                  fVar141 = sqrtf(fVar141);
                  auVar117 = ZEXT416(uVar71);
                  fVar140 = (float)local_780._0_4_;
                  auVar118 = local_7a0._0_16_;
                  auVar83 = local_9a0._0_16_;
                  auVar82 = local_760._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar192,auVar192);
                  fVar141 = auVar91._0_4_;
                }
                auVar262 = ZEXT1664(auVar149);
                auVar279 = ZEXT3264(_local_980);
                auVar247 = ZEXT1664(auVar227);
                auVar91 = vpermilps_avx(local_720._0_16_,0xff);
                fVar141 = fVar141 - auVar91._0_4_;
                auVar116 = vshufps_avx(auVar227,auVar227,0xff);
                auVar91 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar140),auVar116);
                auVar172._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar172._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar172._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar195._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar118 = ZEXT416((uint)(auVar118._0_4_ * fVar140));
                auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar91._0_4_)),auVar193,
                                          auVar118);
                auVar118 = vinsertps_avx(auVar195,auVar118,0x1c);
                uVar80 = auVar91._0_4_;
                auVar196._4_4_ = uVar80;
                auVar196._0_4_ = uVar80;
                auVar196._8_4_ = uVar80;
                auVar196._12_4_ = uVar80;
                auVar118 = vdivps_avx(auVar118,auVar196);
                auVar91 = vinsertps_avx(auVar193,auVar172,0x10);
                auVar91 = vdivps_avx(auVar91,auVar196);
                fVar140 = auVar83._0_4_;
                auVar151._0_4_ = fVar140 * auVar118._0_4_ + fVar141 * auVar91._0_4_;
                auVar151._4_4_ = fVar140 * auVar118._4_4_ + fVar141 * auVar91._4_4_;
                auVar151._8_4_ = fVar140 * auVar118._8_4_ + fVar141 * auVar91._8_4_;
                auVar151._12_4_ = fVar140 * auVar118._12_4_ + fVar141 * auVar91._12_4_;
                auVar84 = vsubps_avx(auVar84,auVar151);
                auVar83 = vandps_avx(auVar83,auVar231);
                if (auVar83._0_4_ < auVar210._0_4_) {
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar117._0_4_ + auVar210._0_4_)),
                                            local_7c0,ZEXT416(0x36000000));
                  auVar117 = vandps_avx(ZEXT416((uint)fVar141),auVar231);
                  if (auVar117._0_4_ < auVar83._0_4_) {
                    fVar140 = auVar84._0_4_ + (float)local_8b0._0_4_;
                    if (fVar140 < fVar79) {
                      bVar78 = 0;
                    }
                    else {
                      fVar141 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar141 < fVar140) {
                        bVar78 = 0;
                      }
                      else {
                        auVar117 = vmovshdup_avx(auVar84);
                        bVar78 = 0;
                        if ((0.0 <= auVar117._0_4_) && (auVar117._0_4_ <= 1.0)) {
                          auVar117 = vrsqrtss_avx(auVar149,auVar149);
                          fVar147 = auVar117._0_4_;
                          pGVar2 = (context->scene->geometries).items[uVar69].ptr;
                          if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar78 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar78 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar139 = fVar147 * 1.5 + fVar139 * -0.5 * fVar147 * fVar147 * fVar147;
                            auVar152._0_4_ = fVar139 * (float)local_900._0_4_;
                            auVar152._4_4_ = fVar139 * (float)local_900._4_4_;
                            auVar152._8_4_ = fVar139 * fStack_8f8;
                            auVar152._12_4_ = fVar139 * fStack_8f4;
                            auVar91 = vfmadd213ps_fma(auVar116,auVar152,auVar227);
                            auVar117 = vshufps_avx(auVar152,auVar152,0xc9);
                            auVar83 = vshufps_avx(auVar227,auVar227,0xc9);
                            auVar153._0_4_ = auVar152._0_4_ * auVar83._0_4_;
                            auVar153._4_4_ = auVar152._4_4_ * auVar83._4_4_;
                            auVar153._8_4_ = auVar152._8_4_ * auVar83._8_4_;
                            auVar153._12_4_ = auVar152._12_4_ * auVar83._12_4_;
                            auVar118 = vfmsub231ps_fma(auVar153,auVar227,auVar117);
                            auVar117 = vshufps_avx(auVar118,auVar118,0xc9);
                            auVar83 = vshufps_avx(auVar91,auVar91,0xc9);
                            auVar118 = vshufps_avx(auVar118,auVar118,0xd2);
                            auVar89._0_4_ = auVar91._0_4_ * auVar118._0_4_;
                            auVar89._4_4_ = auVar91._4_4_ * auVar118._4_4_;
                            auVar89._8_4_ = auVar91._8_4_ * auVar118._8_4_;
                            auVar89._12_4_ = auVar91._12_4_ * auVar118._12_4_;
                            auVar117 = vfmsub231ps_fma(auVar89,auVar117,auVar83);
                            local_6b0 = vshufps_avx(auVar84,auVar84,0x55);
                            local_6e0 = (RTCHitN  [16])vshufps_avx(auVar117,auVar117,0x55);
                            auStack_6d0 = vshufps_avx(auVar117,auVar117,0xaa);
                            local_6c0 = auVar117._0_4_;
                            local_6a0 = ZEXT416(0) << 0x20;
                            local_690 = CONCAT44(uStack_6fc,local_700);
                            uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                            local_680._4_4_ = uStack_6ec;
                            local_680._0_4_ = local_6f0;
                            local_680._8_4_ = uStack_6e8;
                            local_680._12_4_ = uStack_6e4;
                            vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                            uStack_66c = context->user->instID[0];
                            local_670 = uStack_66c;
                            uStack_668 = uStack_66c;
                            uStack_664 = uStack_66c;
                            uStack_660 = context->user->instPrimID[0];
                            uStack_65c = uStack_660;
                            uStack_658 = uStack_660;
                            uStack_654 = uStack_660;
                            *(float *)(ray + k * 4 + 0x80) = fVar140;
                            auVar84 = *(undefined1 (*) [16])
                                       (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_8e0._0_16_ = auVar84;
                            local_9f0.valid = (int *)local_8e0;
                            local_9f0.geometryUserPtr = pGVar2->userPtr;
                            local_9f0.context = context->user;
                            local_9f0.hit = local_6e0;
                            local_9f0.N = 4;
                            local_9f0.ray = (RTCRayN *)ray;
                            uStack_6bc = local_6c0;
                            uStack_6b8 = local_6c0;
                            uStack_6b4 = local_6c0;
                            if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar247 = ZEXT1664(auVar227);
                              auVar262 = ZEXT1664(auVar149);
                              (*pGVar2->occlusionFilterN)(&local_9f0);
                              auVar279 = ZEXT3264(_local_980);
                              auVar84 = local_8e0._0_16_;
                            }
                            if (auVar84 == (undefined1  [16])0x0) {
                              auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar84 = auVar84 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var3 = context->args->filter;
                              if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar247 = ZEXT1664(auVar247._0_16_);
                                auVar262 = ZEXT1664(auVar262._0_16_);
                                (*p_Var3)(&local_9f0);
                                auVar279 = ZEXT3264(_local_980);
                                auVar84 = local_8e0._0_16_;
                              }
                              auVar149 = vpcmpeqd_avx(auVar84,_DAT_01f7aa10);
                              auVar84 = auVar149 ^ _DAT_01f7ae20;
                              auVar154._8_4_ = 0xff800000;
                              auVar154._0_8_ = 0xff800000ff800000;
                              auVar154._12_4_ = 0xff800000;
                              auVar149 = vblendvps_avx(auVar154,*(undefined1 (*) [16])
                                                                 (local_9f0.ray + 0x80),auVar149);
                              *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar149;
                            }
                            auVar125._8_8_ = 0x100000001;
                            auVar125._0_8_ = 0x100000001;
                            bVar78 = (auVar125 & auVar84) != (undefined1  [16])0x0;
                            if (!(bool)bVar78) {
                              *(float *)(ray + k * 4 + 0x80) = fVar141;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_015e2670;
                  }
                }
                bVar77 = uVar73 < 4;
                uVar73 = uVar73 + 1;
              } while (uVar73 != 5);
              bVar77 = false;
              bVar78 = 5;
LAB_015e2670:
              bVar76 = (bool)(bVar76 | bVar77 & bVar78);
              uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar107._4_4_ = uVar80;
              auVar107._0_4_ = uVar80;
              auVar107._8_4_ = uVar80;
              auVar107._12_4_ = uVar80;
              auVar107._16_4_ = uVar80;
              auVar107._20_4_ = uVar80;
              auVar107._24_4_ = uVar80;
              auVar107._28_4_ = uVar80;
              auVar219 = vcmpps_avx(_local_b60,auVar107,2);
              auVar95 = vandps_avx(auVar219,local_560);
              auVar137 = ZEXT3264(auVar95);
              auVar219 = local_560 & auVar219;
              local_560 = auVar95;
            } while ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar219 >> 0x7f,0) != '\0') ||
                       (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar219 >> 0xbf,0) != '\0') ||
                     (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar219[0x1f] < '\0');
            auVar137 = ZEXT3264(local_3e0);
          }
          auVar98 = local_3e0;
          auVar138._0_4_ = auVar279._0_4_ * (float)local_880._0_4_;
          auVar138._4_4_ = auVar279._4_4_ * (float)local_880._4_4_;
          auVar138._8_4_ = auVar279._8_4_ * fStack_878;
          auVar138._12_4_ = auVar279._12_4_ * fStack_874;
          auVar138._16_4_ = auVar279._16_4_ * fStack_870;
          auVar138._20_4_ = auVar279._20_4_ * fStack_86c;
          auVar138._28_36_ = auVar137._28_36_;
          auVar138._24_4_ = auVar279._24_4_ * fStack_868;
          auVar84 = vfmadd213ps_fma(local_860,_local_9c0,auVar138._0_32_);
          auVar84 = vfmadd213ps_fma(_local_840,_local_7e0,ZEXT1632(auVar84));
          auVar60._4_4_ = uStack_81c;
          auVar60._0_4_ = local_820;
          auVar60._8_4_ = uStack_818;
          auVar60._12_4_ = uStack_814;
          auVar60._16_4_ = uStack_810;
          auVar60._20_4_ = uStack_80c;
          auVar60._24_4_ = uStack_808;
          auVar60._28_4_ = uStack_804;
          auVar95 = vandps_avx(ZEXT1632(auVar84),auVar60);
          auVar163._8_4_ = 0x3e99999a;
          auVar163._0_8_ = 0x3e99999a3e99999a;
          auVar163._12_4_ = 0x3e99999a;
          auVar163._16_4_ = 0x3e99999a;
          auVar163._20_4_ = 0x3e99999a;
          auVar163._24_4_ = 0x3e99999a;
          auVar163._28_4_ = 0x3e99999a;
          auVar95 = vcmpps_avx(auVar95,auVar163,1);
          auVar219 = vorps_avx(auVar95,local_5e0);
          auVar164._0_4_ = (float)local_640._0_4_ + (float)local_920._0_4_;
          auVar164._4_4_ = (float)local_640._4_4_ + (float)local_920._4_4_;
          auVar164._8_4_ = fStack_638 + fStack_918;
          auVar164._12_4_ = fStack_634 + fStack_914;
          auVar164._16_4_ = fStack_630 + fStack_910;
          auVar164._20_4_ = fStack_62c + fStack_90c;
          auVar164._24_4_ = fStack_628 + fStack_908;
          auVar164._28_4_ = fStack_624 + fStack_904;
          auVar95 = vcmpps_avx(auVar164,auVar107,2);
          local_860 = vandps_avx(auVar95,local_5c0);
          auVar165._8_4_ = 3;
          auVar165._0_8_ = 0x300000003;
          auVar165._12_4_ = 3;
          auVar165._16_4_ = 3;
          auVar165._20_4_ = 3;
          auVar165._24_4_ = 3;
          auVar165._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar95 = vblendvps_avx(auVar184,auVar165,auVar219);
          _local_880 = vpcmpgtd_avx2(auVar95,local_600);
          auVar95 = vpandn_avx2(_local_880,local_860);
          auVar219 = local_860 & ~_local_880;
          local_8e0 = auVar95;
          if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar219 >> 0x7f,0) != '\0') ||
                (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0xbf,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar219[0x1f] < '\0') {
            auVar149 = vminps_avx(auVar8,auVar10);
            auVar84 = vmaxps_avx(auVar8,auVar10);
            auVar117 = vminps_avx(auVar9,auVar85);
            auVar83 = vminps_avx(auVar149,auVar117);
            auVar149 = vmaxps_avx(auVar9,auVar85);
            auVar117 = vmaxps_avx(auVar84,auVar149);
            auVar84 = vandps_avx(auVar83,auVar231);
            auVar149 = vandps_avx(auVar117,auVar231);
            auVar84 = vmaxps_avx(auVar84,auVar149);
            auVar149 = vmovshdup_avx(auVar84);
            auVar149 = vmaxss_avx(auVar149,auVar84);
            auVar84 = vshufpd_avx(auVar84,auVar84,1);
            auVar84 = vmaxss_avx(auVar84,auVar149);
            fVar115 = auVar84._0_4_ * 1.9073486e-06;
            local_7c0 = vshufps_avx(auVar117,auVar117,0xff);
            local_840._4_4_ = (float)local_920._4_4_ + local_3e0._4_4_;
            local_840._0_4_ = (float)local_920._0_4_ + local_3e0._0_4_;
            fStack_838 = fStack_918 + local_3e0._8_4_;
            fStack_834 = fStack_914 + local_3e0._12_4_;
            fStack_830 = fStack_910 + local_3e0._16_4_;
            fStack_82c = fStack_90c + local_3e0._20_4_;
            fStack_828 = fStack_908 + local_3e0._24_4_;
            fStack_824 = fStack_904 + local_3e0._28_4_;
            do {
              auVar109._8_4_ = 0x7f800000;
              auVar109._0_8_ = 0x7f8000007f800000;
              auVar109._12_4_ = 0x7f800000;
              auVar109._16_4_ = 0x7f800000;
              auVar109._20_4_ = 0x7f800000;
              auVar109._24_4_ = 0x7f800000;
              auVar109._28_4_ = 0x7f800000;
              auVar219 = vblendvps_avx(auVar109,auVar98,auVar95);
              auVar252 = vshufps_avx(auVar219,auVar219,0xb1);
              auVar252 = vminps_avx(auVar219,auVar252);
              auVar13 = vshufpd_avx(auVar252,auVar252,5);
              auVar252 = vminps_avx(auVar252,auVar13);
              auVar13 = vpermpd_avx2(auVar252,0x4e);
              auVar252 = vminps_avx(auVar252,auVar13);
              auVar252 = vcmpps_avx(auVar219,auVar252,0);
              auVar13 = auVar95 & auVar252;
              auVar219 = auVar95;
              if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0x7f,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar13 >> 0xbf,0) != '\0') ||
                  (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar13[0x1f] < '\0') {
                auVar219 = vandps_avx(auVar252,auVar95);
              }
              uVar71 = vmovmskps_avx(auVar219);
              iVar21 = 0;
              for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar72 = iVar21 << 2;
              local_8e0 = auVar95;
              *(undefined4 *)(local_8e0 + uVar72) = 0;
              uVar71 = *(uint *)(local_1c0 + uVar72);
              uVar72 = *(uint *)(local_3c0 + uVar72);
              fVar139 = auVar7._0_4_;
              if ((float)local_940._0_4_ < 0.0) {
                auVar279 = ZEXT1664(auVar279._0_16_);
                fVar139 = sqrtf((float)local_940._0_4_);
              }
              local_740._0_4_ = fVar139 * 1.9073486e-06;
              auVar84 = vinsertps_avx(ZEXT416(uVar72),ZEXT416(uVar71),0x10);
              bVar77 = true;
              uVar73 = 0;
              do {
                auVar117 = vmovshdup_avx(auVar84);
                fVar143 = 1.0 - auVar117._0_4_;
                auVar149 = vshufps_avx(auVar84,auVar84,0x55);
                fVar139 = auVar149._0_4_;
                auVar126._0_4_ = fVar113 * fVar139;
                fVar140 = auVar149._4_4_;
                auVar126._4_4_ = auVar10._4_4_ * fVar140;
                fVar141 = auVar149._8_4_;
                auVar126._8_4_ = auVar10._8_4_ * fVar141;
                fVar147 = auVar149._12_4_;
                auVar126._12_4_ = auVar10._12_4_ * fVar147;
                auVar155._4_4_ = fVar143;
                auVar155._0_4_ = fVar143;
                auVar155._8_4_ = fVar143;
                auVar155._12_4_ = fVar143;
                auVar149 = vfmadd231ps_fma(auVar126,auVar155,auVar8);
                auVar173._0_4_ = fVar114 * fVar139;
                auVar173._4_4_ = auVar9._4_4_ * fVar140;
                auVar173._8_4_ = auVar9._8_4_ * fVar141;
                auVar173._12_4_ = auVar9._12_4_ * fVar147;
                auVar83 = vfmadd231ps_fma(auVar173,auVar155,auVar10);
                auVar217._0_4_ = fVar139 * auVar83._0_4_;
                auVar217._4_4_ = fVar140 * auVar83._4_4_;
                auVar217._8_4_ = fVar141 * auVar83._8_4_;
                auVar217._12_4_ = fVar147 * auVar83._12_4_;
                auVar118 = vfmadd231ps_fma(auVar217,auVar155,auVar149);
                auVar127._0_4_ = fVar139 * fVar112;
                auVar127._4_4_ = fVar140 * fStack_abc;
                auVar127._8_4_ = fVar141 * fStack_ab8;
                auVar127._12_4_ = fVar147 * fStack_ab4;
                auVar149 = vfmadd231ps_fma(auVar127,auVar155,auVar9);
                auVar197._0_4_ = fVar139 * auVar149._0_4_;
                auVar197._4_4_ = fVar140 * auVar149._4_4_;
                auVar197._8_4_ = fVar141 * auVar149._8_4_;
                auVar197._12_4_ = fVar147 * auVar149._12_4_;
                auVar83 = vfmadd231ps_fma(auVar197,auVar155,auVar83);
                fVar145 = auVar84._0_4_;
                auVar128._4_4_ = fVar145;
                auVar128._0_4_ = fVar145;
                auVar128._8_4_ = fVar145;
                auVar128._12_4_ = fVar145;
                auVar149 = vfmadd213ps_fma(auVar128,local_930,_DAT_01f7aa10);
                auVar90._0_4_ = fVar139 * auVar83._0_4_;
                auVar90._4_4_ = fVar140 * auVar83._4_4_;
                auVar90._8_4_ = fVar141 * auVar83._8_4_;
                auVar90._12_4_ = fVar147 * auVar83._12_4_;
                auVar91 = vfmadd231ps_fma(auVar90,auVar118,auVar155);
                local_720._0_16_ = auVar91;
                auVar149 = vsubps_avx(auVar149,auVar91);
                _local_900 = auVar149;
                auVar149 = vdpps_avx(auVar149,auVar149,0x7f);
                fVar139 = auVar149._0_4_;
                if (fVar139 < 0.0) {
                  auVar279 = ZEXT1664(auVar279._0_16_);
                  auVar111._0_4_ = sqrtf(fVar139);
                  auVar111._4_60_ = extraout_var_00;
                  auVar91 = auVar111._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar149,auVar149);
                }
                auVar83 = vsubps_avx(auVar83,auVar118);
                auVar228._0_4_ = auVar83._0_4_ * 3.0;
                auVar228._4_4_ = auVar83._4_4_ * 3.0;
                auVar228._8_4_ = auVar83._8_4_ * 3.0;
                auVar228._12_4_ = auVar83._12_4_ * 3.0;
                auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar143),
                                          auVar117);
                auVar118 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar117,
                                           ZEXT416((uint)fVar143));
                fVar143 = fVar143 * 6.0;
                fVar140 = auVar83._0_4_ * 6.0;
                fVar141 = auVar118._0_4_ * 6.0;
                fVar147 = auVar117._0_4_ * 6.0;
                auVar174._0_4_ = fVar147 * fVar112;
                auVar174._4_4_ = fVar147 * fStack_abc;
                auVar174._8_4_ = fVar147 * fStack_ab8;
                auVar174._12_4_ = fVar147 * fStack_ab4;
                auVar129._4_4_ = fVar141;
                auVar129._0_4_ = fVar141;
                auVar129._8_4_ = fVar141;
                auVar129._12_4_ = fVar141;
                auVar117 = vfmadd132ps_fma(auVar129,auVar174,auVar9);
                auVar175._4_4_ = fVar140;
                auVar175._0_4_ = fVar140;
                auVar175._8_4_ = fVar140;
                auVar175._12_4_ = fVar140;
                auVar117 = vfmadd132ps_fma(auVar175,auVar117,auVar10);
                auVar83 = vdpps_avx(auVar228,auVar228,0x7f);
                auVar130._4_4_ = fVar143;
                auVar130._0_4_ = fVar143;
                auVar130._8_4_ = fVar143;
                auVar130._12_4_ = fVar143;
                auVar193 = vfmadd132ps_fma(auVar130,auVar117,auVar8);
                auVar117 = vblendps_avx(auVar83,_DAT_01f7aa10,0xe);
                auVar118 = vrsqrtss_avx(auVar117,auVar117);
                fVar147 = auVar83._0_4_;
                fVar140 = auVar118._0_4_;
                auVar118 = vdpps_avx(auVar228,auVar193,0x7f);
                fVar140 = fVar140 * 1.5 + fVar147 * -0.5 * fVar140 * fVar140 * fVar140;
                auVar131._0_4_ = auVar193._0_4_ * fVar147;
                auVar131._4_4_ = auVar193._4_4_ * fVar147;
                auVar131._8_4_ = auVar193._8_4_ * fVar147;
                auVar131._12_4_ = auVar193._12_4_ * fVar147;
                fVar141 = auVar118._0_4_;
                auVar218._0_4_ = auVar228._0_4_ * fVar141;
                auVar218._4_4_ = auVar228._4_4_ * fVar141;
                auVar218._8_4_ = auVar228._8_4_ * fVar141;
                auVar218._12_4_ = auVar228._12_4_ * fVar141;
                auVar118 = vsubps_avx(auVar131,auVar218);
                auVar117 = vrcpss_avx(auVar117,auVar117);
                auVar193 = vfnmadd213ss_fma(auVar117,auVar83,ZEXT416(0x40000000));
                fVar141 = auVar117._0_4_ * auVar193._0_4_;
                auVar117 = vmaxss_avx(ZEXT416((uint)fVar115),
                                      ZEXT416((uint)(fVar145 * (float)local_740._0_4_)));
                auVar137 = ZEXT1664(auVar117);
                uVar55 = CONCAT44(auVar228._4_4_,auVar228._0_4_);
                auVar242._0_8_ = uVar55 ^ 0x8000000080000000;
                auVar242._8_4_ = -auVar228._8_4_;
                auVar242._12_4_ = -auVar228._12_4_;
                auVar176._0_4_ = fVar140 * auVar118._0_4_ * fVar141;
                auVar176._4_4_ = fVar140 * auVar118._4_4_ * fVar141;
                auVar176._8_4_ = fVar140 * auVar118._8_4_ * fVar141;
                auVar176._12_4_ = fVar140 * auVar118._12_4_ * fVar141;
                local_960._0_4_ = auVar228._0_4_ * fVar140;
                local_960._4_4_ = auVar228._4_4_ * fVar140;
                local_960._8_4_ = auVar228._8_4_ * fVar140;
                local_960._12_4_ = auVar228._12_4_ * fVar140;
                if (fVar147 < -fVar147) {
                  local_9a0._0_16_ = auVar176;
                  auVar279 = ZEXT1664(auVar279._0_16_);
                  fVar140 = sqrtf(fVar147);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar137 = ZEXT464(auVar117._0_4_);
                  auVar176 = local_9a0._0_16_;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar140 = auVar83._0_4_;
                }
                auVar83 = vdpps_avx(_local_900,local_960._0_16_,0x7f);
                auVar116 = vfmadd213ss_fma(ZEXT416((uint)fVar115),auVar91,auVar137._0_16_);
                auVar118 = vdpps_avx(auVar242,local_960._0_16_,0x7f);
                auVar193 = vdpps_avx(_local_900,auVar176,0x7f);
                auVar82 = vdpps_avx(local_930,local_960._0_16_,0x7f);
                auVar210 = vfmadd213ss_fma(ZEXT416((uint)(auVar91._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar115 / fVar140)),auVar116);
                auVar92._0_4_ = auVar83._0_4_ * auVar83._0_4_;
                auVar92._4_4_ = auVar83._4_4_ * auVar83._4_4_;
                auVar92._8_4_ = auVar83._8_4_ * auVar83._8_4_;
                auVar92._12_4_ = auVar83._12_4_ * auVar83._12_4_;
                auVar91 = vdpps_avx(_local_900,auVar242,0x7f);
                auVar192 = vsubps_avx(auVar149,auVar92);
                auVar116 = vrsqrtss_avx(auVar192,auVar192);
                fVar141 = auVar192._0_4_;
                fVar140 = auVar116._0_4_;
                fVar140 = fVar140 * 1.5 + fVar141 * -0.5 * fVar140 * fVar140 * fVar140;
                auVar116 = vdpps_avx(_local_900,local_930,0x7f);
                auVar193 = ZEXT416((uint)(auVar118._0_4_ + auVar193._0_4_));
                local_960._0_16_ = vfnmadd231ss_fma(auVar91,auVar83,auVar193);
                auVar118 = vfnmadd231ss_fma(auVar116,auVar83,auVar82);
                if (fVar141 < 0.0) {
                  local_9a0._0_16_ = auVar83;
                  local_760._0_16_ = auVar82;
                  local_780._0_4_ = fVar140;
                  local_7a0._0_16_ = auVar118;
                  auVar279 = ZEXT1664(auVar279._0_16_);
                  fVar141 = sqrtf(fVar141);
                  auVar137 = ZEXT464(auVar117._0_4_);
                  fVar140 = (float)local_780._0_4_;
                  auVar118 = local_7a0._0_16_;
                  auVar83 = local_9a0._0_16_;
                  auVar82 = local_760._0_16_;
                }
                else {
                  auVar117 = vsqrtss_avx(auVar192,auVar192);
                  fVar141 = auVar117._0_4_;
                }
                auVar262 = ZEXT1664(auVar149);
                auVar247 = ZEXT1664(auVar228);
                auVar117 = vpermilps_avx(local_720._0_16_,0xff);
                fVar141 = fVar141 - auVar117._0_4_;
                auVar91 = vshufps_avx(auVar228,auVar228,0xff);
                auVar117 = vfmsub213ss_fma(local_960._0_16_,ZEXT416((uint)fVar140),auVar91);
                auVar177._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar177._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar177._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar198._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
                auVar198._8_4_ = auVar117._8_4_ ^ 0x80000000;
                auVar198._12_4_ = auVar117._12_4_ ^ 0x80000000;
                auVar116 = ZEXT416((uint)(auVar118._0_4_ * fVar140));
                auVar118 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar117._0_4_)),auVar193,
                                           auVar116);
                auVar117 = vinsertps_avx(auVar198,auVar116,0x1c);
                uVar80 = auVar118._0_4_;
                auVar199._4_4_ = uVar80;
                auVar199._0_4_ = uVar80;
                auVar199._8_4_ = uVar80;
                auVar199._12_4_ = uVar80;
                auVar117 = vdivps_avx(auVar117,auVar199);
                auVar118 = vinsertps_avx(auVar193,auVar177,0x10);
                auVar118 = vdivps_avx(auVar118,auVar199);
                fVar140 = auVar83._0_4_;
                auVar156._0_4_ = fVar140 * auVar117._0_4_ + fVar141 * auVar118._0_4_;
                auVar156._4_4_ = fVar140 * auVar117._4_4_ + fVar141 * auVar118._4_4_;
                auVar156._8_4_ = fVar140 * auVar117._8_4_ + fVar141 * auVar118._8_4_;
                auVar156._12_4_ = fVar140 * auVar117._12_4_ + fVar141 * auVar118._12_4_;
                auVar84 = vsubps_avx(auVar84,auVar156);
                auVar117 = vandps_avx(auVar83,auVar231);
                if (auVar117._0_4_ < auVar210._0_4_) {
                  auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar137._0_4_ + auVar210._0_4_)),
                                            local_7c0,ZEXT416(0x36000000));
                  auVar117 = vandps_avx(ZEXT416((uint)fVar141),auVar231);
                  if (auVar117._0_4_ < auVar83._0_4_) {
                    fVar140 = auVar84._0_4_ + (float)local_8b0._0_4_;
                    if (fVar140 < fVar79) {
                      bVar78 = 0;
                    }
                    else {
                      fVar141 = *(float *)(ray + k * 4 + 0x80);
                      if (fVar141 < fVar140) {
                        bVar78 = 0;
                      }
                      else {
                        auVar117 = vmovshdup_avx(auVar84);
                        bVar78 = 0;
                        if ((0.0 <= auVar117._0_4_) && (auVar117._0_4_ <= 1.0)) {
                          auVar117 = vrsqrtss_avx(auVar149,auVar149);
                          fVar147 = auVar117._0_4_;
                          pGVar2 = (context->scene->geometries).items[uVar69].ptr;
                          if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar78 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar78 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar139 = fVar147 * 1.5 + fVar139 * -0.5 * fVar147 * fVar147 * fVar147;
                            auVar157._0_4_ = fVar139 * (float)local_900._0_4_;
                            auVar157._4_4_ = fVar139 * (float)local_900._4_4_;
                            auVar157._8_4_ = fVar139 * fStack_8f8;
                            auVar157._12_4_ = fVar139 * fStack_8f4;
                            auVar91 = vfmadd213ps_fma(auVar91,auVar157,auVar228);
                            auVar117 = vshufps_avx(auVar157,auVar157,0xc9);
                            auVar83 = vshufps_avx(auVar228,auVar228,0xc9);
                            auVar158._0_4_ = auVar157._0_4_ * auVar83._0_4_;
                            auVar158._4_4_ = auVar157._4_4_ * auVar83._4_4_;
                            auVar158._8_4_ = auVar157._8_4_ * auVar83._8_4_;
                            auVar158._12_4_ = auVar157._12_4_ * auVar83._12_4_;
                            auVar118 = vfmsub231ps_fma(auVar158,auVar228,auVar117);
                            auVar117 = vshufps_avx(auVar118,auVar118,0xc9);
                            auVar83 = vshufps_avx(auVar91,auVar91,0xc9);
                            auVar118 = vshufps_avx(auVar118,auVar118,0xd2);
                            auVar93._0_4_ = auVar91._0_4_ * auVar118._0_4_;
                            auVar93._4_4_ = auVar91._4_4_ * auVar118._4_4_;
                            auVar93._8_4_ = auVar91._8_4_ * auVar118._8_4_;
                            auVar93._12_4_ = auVar91._12_4_ * auVar118._12_4_;
                            auVar117 = vfmsub231ps_fma(auVar93,auVar117,auVar83);
                            local_6b0 = vshufps_avx(auVar84,auVar84,0x55);
                            local_6e0 = (RTCHitN  [16])vshufps_avx(auVar117,auVar117,0x55);
                            auStack_6d0 = vshufps_avx(auVar117,auVar117,0xaa);
                            local_6c0 = auVar117._0_4_;
                            local_6a0 = ZEXT416(0) << 0x20;
                            local_690 = CONCAT44(uStack_6fc,local_700);
                            uStack_688 = CONCAT44(uStack_6f4,uStack_6f8);
                            local_680._4_4_ = uStack_6ec;
                            local_680._0_4_ = local_6f0;
                            local_680._8_4_ = uStack_6e8;
                            local_680._12_4_ = uStack_6e4;
                            vpcmpeqd_avx2(ZEXT1632(local_680),ZEXT1632(local_680));
                            uStack_66c = context->user->instID[0];
                            local_670 = uStack_66c;
                            uStack_668 = uStack_66c;
                            uStack_664 = uStack_66c;
                            uStack_660 = context->user->instPrimID[0];
                            uStack_65c = uStack_660;
                            uStack_658 = uStack_660;
                            uStack_654 = uStack_660;
                            *(float *)(ray + k * 4 + 0x80) = fVar140;
                            local_8a0 = *(undefined1 (*) [16])
                                         (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                            local_9f0.valid = (int *)local_8a0;
                            local_9f0.geometryUserPtr = pGVar2->userPtr;
                            local_9f0.context = context->user;
                            local_9f0.hit = local_6e0;
                            local_9f0.N = 4;
                            local_9f0.ray = (RTCRayN *)ray;
                            uStack_6bc = local_6c0;
                            uStack_6b8 = local_6c0;
                            uStack_6b4 = local_6c0;
                            if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar247 = ZEXT1664(auVar228);
                              auVar262 = ZEXT1664(auVar149);
                              auVar279 = ZEXT1664(auVar279._0_16_);
                              (*pGVar2->occlusionFilterN)(&local_9f0);
                            }
                            if (local_8a0 == (undefined1  [16])0x0) {
                              auVar84 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar84 = auVar84 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var3 = context->args->filter;
                              if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar247 = ZEXT1664(auVar247._0_16_);
                                auVar262 = ZEXT1664(auVar262._0_16_);
                                auVar279 = ZEXT1664(auVar279._0_16_);
                                (*p_Var3)(&local_9f0);
                              }
                              auVar149 = vpcmpeqd_avx(local_8a0,_DAT_01f7aa10);
                              auVar84 = auVar149 ^ _DAT_01f7ae20;
                              auVar159._8_4_ = 0xff800000;
                              auVar159._0_8_ = 0xff800000ff800000;
                              auVar159._12_4_ = 0xff800000;
                              auVar149 = vblendvps_avx(auVar159,*(undefined1 (*) [16])
                                                                 (local_9f0.ray + 0x80),auVar149);
                              *(undefined1 (*) [16])(local_9f0.ray + 0x80) = auVar149;
                            }
                            auVar132._8_8_ = 0x100000001;
                            auVar132._0_8_ = 0x100000001;
                            bVar78 = (auVar132 & auVar84) != (undefined1  [16])0x0;
                            if (!(bool)bVar78) {
                              *(float *)(ray + k * 4 + 0x80) = fVar141;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_015e30e0;
                  }
                }
                bVar77 = uVar73 < 4;
                uVar73 = uVar73 + 1;
              } while (uVar73 != 5);
              bVar77 = false;
              bVar78 = 5;
LAB_015e30e0:
              bVar76 = (bool)(bVar76 | bVar77 & bVar78);
              uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar107._4_4_ = uVar80;
              auVar107._0_4_ = uVar80;
              auVar107._8_4_ = uVar80;
              auVar107._12_4_ = uVar80;
              auVar107._16_4_ = uVar80;
              auVar107._20_4_ = uVar80;
              auVar107._24_4_ = uVar80;
              auVar107._28_4_ = uVar80;
              auVar219 = vcmpps_avx(_local_840,auVar107,2);
              auVar95 = vandps_avx(auVar219,local_8e0);
              auVar219 = local_8e0 & auVar219;
              local_8e0 = auVar95;
            } while ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar219 >> 0x7f,0) != '\0') ||
                       (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar219 >> 0xbf,0) != '\0') ||
                     (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar219[0x1f] < '\0');
          }
          auVar166._0_4_ = (float)local_920._0_4_ + local_420._0_4_;
          auVar166._4_4_ = (float)local_920._4_4_ + local_420._4_4_;
          auVar166._8_4_ = fStack_918 + local_420._8_4_;
          auVar166._12_4_ = fStack_914 + local_420._12_4_;
          auVar166._16_4_ = fStack_910 + local_420._16_4_;
          auVar166._20_4_ = fStack_90c + local_420._20_4_;
          auVar166._24_4_ = fStack_908 + local_420._24_4_;
          auVar166._28_4_ = fStack_904 + local_420._28_4_;
          auVar219 = vcmpps_avx(auVar166,auVar107,2);
          auVar95 = vandps_avx(local_5a0,local_580);
          auVar95 = vandps_avx(auVar219,auVar95);
          auVar185._0_4_ = local_3e0._0_4_ + (float)local_920._0_4_;
          auVar185._4_4_ = local_3e0._4_4_ + (float)local_920._4_4_;
          auVar185._8_4_ = local_3e0._8_4_ + fStack_918;
          auVar185._12_4_ = local_3e0._12_4_ + fStack_914;
          auVar185._16_4_ = local_3e0._16_4_ + fStack_910;
          auVar185._20_4_ = local_3e0._20_4_ + fStack_90c;
          auVar185._24_4_ = local_3e0._24_4_ + fStack_908;
          auVar185._28_4_ = local_3e0._28_4_ + fStack_904;
          auVar98 = vcmpps_avx(auVar185,auVar107,2);
          auVar219 = vandps_avx(_local_880,local_860);
          auVar219 = vandps_avx(auVar98,auVar219);
          auVar219 = vorps_avx(auVar95,auVar219);
          if ((((((((auVar219 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar219 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar219 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar219 >> 0x7f,0) != '\0') ||
                (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar219 >> 0xbf,0) != '\0') ||
              (auVar219 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar219[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar75 * 0x60) = auVar219;
            auVar95 = vblendvps_avx(local_3e0,local_420,auVar95);
            *(undefined1 (*) [32])(auStack_160 + uVar75 * 0x60) = auVar95;
            uVar81 = vmovlps_avx(local_510);
            (&uStack_140)[uVar75 * 0xc] = uVar81;
            aiStack_138[uVar75 * 0x18] = local_bc8 + 1;
            iVar74 = iVar74 + 1;
          }
        }
      }
    }
    auVar219 = local_4c0;
    if (iVar74 == 0) break;
    uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar104._4_4_ = uVar80;
    auVar104._0_4_ = uVar80;
    auVar104._8_4_ = uVar80;
    auVar104._12_4_ = uVar80;
    auVar104._16_4_ = uVar80;
    auVar104._20_4_ = uVar80;
    auVar104._24_4_ = uVar80;
    auVar104._28_4_ = uVar80;
    uVar71 = -iVar74;
    pauVar70 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar74 - 1) * 0x60);
    fVar115 = (float)local_920._0_4_;
    fVar139 = (float)local_920._4_4_;
    fVar140 = fStack_918;
    fVar141 = fStack_914;
    fVar147 = fStack_910;
    fVar143 = fStack_90c;
    fVar145 = fStack_908;
    fVar142 = fStack_904;
    while( true ) {
      auVar95 = pauVar70[1];
      auVar133._0_4_ = fVar115 + auVar95._0_4_;
      auVar133._4_4_ = fVar139 + auVar95._4_4_;
      auVar133._8_4_ = fVar140 + auVar95._8_4_;
      auVar133._12_4_ = fVar141 + auVar95._12_4_;
      auVar133._16_4_ = fVar147 + auVar95._16_4_;
      auVar133._20_4_ = fVar143 + auVar95._20_4_;
      auVar133._24_4_ = fVar145 + auVar95._24_4_;
      auVar133._28_4_ = fVar142 + auVar95._28_4_;
      auVar98 = vcmpps_avx(auVar133,auVar104,2);
      _local_6e0 = vandps_avx(auVar98,*pauVar70);
      auVar98 = *pauVar70 & auVar98;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar98 >> 0x7f,0) != '\0') ||
            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar98 >> 0xbf,0) != '\0') ||
          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar98[0x1f] < '\0') break;
      pauVar70 = pauVar70 + -3;
      uVar71 = uVar71 + 1;
      fVar115 = (float)local_920._0_4_;
      fVar139 = (float)local_920._4_4_;
      fVar140 = fStack_918;
      fVar141 = fStack_914;
      fVar147 = fStack_910;
      fVar143 = fStack_90c;
      fVar145 = fStack_908;
      fVar142 = fStack_904;
      if (uVar71 == 0) goto LAB_015e35dc;
    }
    auVar105._8_4_ = 0x7f800000;
    auVar105._0_8_ = 0x7f8000007f800000;
    auVar105._12_4_ = 0x7f800000;
    auVar105._16_4_ = 0x7f800000;
    auVar105._20_4_ = 0x7f800000;
    auVar105._24_4_ = 0x7f800000;
    auVar105._28_4_ = 0x7f800000;
    auVar95 = vblendvps_avx(auVar105,auVar95,_local_6e0);
    auVar98 = vshufps_avx(auVar95,auVar95,0xb1);
    auVar98 = vminps_avx(auVar95,auVar98);
    auVar252 = vshufpd_avx(auVar98,auVar98,5);
    auVar98 = vminps_avx(auVar98,auVar252);
    auVar252 = vpermpd_avx2(auVar98,0x4e);
    auVar98 = vminps_avx(auVar98,auVar252);
    auVar98 = vcmpps_avx(auVar95,auVar98,0);
    auVar252 = _local_6e0 & auVar98;
    auVar95 = _local_6e0;
    if ((((((((auVar252 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar252 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar252 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar252 >> 0x7f,0) != '\0') ||
          (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar252 >> 0xbf,0) != '\0') ||
        (auVar252 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar252[0x1f] < '\0') {
      auVar95 = vandps_avx(auVar98,_local_6e0);
    }
    uVar73 = *(ulong *)pauVar70[2];
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar73;
    uVar72 = vmovmskps_avx(auVar95);
    iVar74 = 0;
    for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
      iVar74 = iVar74 + 1;
    }
    *(undefined4 *)(local_6e0 + (uint)(iVar74 << 2)) = 0;
    uVar72 = ~uVar71;
    if ((((((((_local_6e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_6e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_6e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_6e0 >> 0x7f,0) != '\0') ||
          (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_6e0 >> 0xbf,0) != '\0') ||
        (_local_6e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_6e0[0x1f] < '\0') {
      uVar72 = -uVar71;
    }
    uVar75 = (ulong)uVar72;
    local_bc8 = *(int *)(pauVar70[2] + 8);
    *pauVar70 = _local_6e0;
    uVar80 = (undefined4)uVar73;
    auVar134._4_4_ = uVar80;
    auVar134._0_4_ = uVar80;
    auVar134._8_4_ = uVar80;
    auVar134._12_4_ = uVar80;
    auVar134._16_4_ = uVar80;
    auVar134._20_4_ = uVar80;
    auVar134._24_4_ = uVar80;
    auVar134._28_4_ = uVar80;
    auVar84 = vmovshdup_avx(auVar86);
    auVar84 = vsubps_avx(auVar84,auVar86);
    auVar106._0_4_ = auVar84._0_4_;
    auVar106._4_4_ = auVar106._0_4_;
    auVar106._8_4_ = auVar106._0_4_;
    auVar106._12_4_ = auVar106._0_4_;
    auVar106._16_4_ = auVar106._0_4_;
    auVar106._20_4_ = auVar106._0_4_;
    auVar106._24_4_ = auVar106._0_4_;
    auVar106._28_4_ = auVar106._0_4_;
    auVar84 = vfmadd132ps_fma(auVar106,auVar134,_DAT_01faff20);
    local_420 = ZEXT1632(auVar84);
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_420 + (uint)(iVar74 << 2));
  } while( true );
LAB_015e35dc:
  if (bVar76 != false) {
    return bVar76;
  }
  uVar80 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar94._4_4_ = uVar80;
  auVar94._0_4_ = uVar80;
  auVar94._8_4_ = uVar80;
  auVar94._12_4_ = uVar80;
  auVar5 = vcmpps_avx(local_520,auVar94,2);
  uVar69 = vmovmskps_avx(auVar5);
  uVar69 = uVar69 & (uint)local_888 - 1 & (uint)local_888;
  if (uVar69 == 0) {
    return false;
  }
  goto LAB_015e0f7e;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }